

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  bool bVar68;
  float fVar69;
  float fVar106;
  float fVar107;
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar108;
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar83 [16];
  undefined1 auVar100 [32];
  undefined1 auVar84 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar109;
  vint4 bi;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar119 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  float fVar186;
  float fVar188;
  vint4 ai_1;
  undefined1 auVar173 [16];
  float fVar190;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar193;
  float fVar215;
  float fVar217;
  vint4 ai_2;
  undefined1 auVar194 [16];
  float fVar219;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar216;
  float fVar218;
  float fVar220;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  float fVar234;
  float fVar235;
  undefined1 auVar222 [16];
  float fVar236;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  vint4 ai;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar263;
  float fVar282;
  float fVar284;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar283;
  float fVar285;
  float fVar286;
  undefined1 auVar281 [32];
  float fVar287;
  float fVar298;
  float fVar299;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar296 [32];
  float fVar300;
  undefined1 auVar297 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  float fVar320;
  float fVar328;
  float fVar329;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar330;
  undefined1 auVar327 [16];
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar341;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar350;
  vfloat4 a0;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_458 [16];
  undefined1 (*local_448) [16];
  Primitive *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  uint auStack_3b8 [4];
  RTCFilterFunctionNArguments local_3a8;
  undefined1 local_378 [32];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar249 [32];
  undefined1 auVar347 [32];
  
  PVar7 = prim[1];
  uVar61 = (ulong)(byte)PVar7;
  lVar62 = uVar61 * 0x25;
  fVar109 = *(float *)(prim + lVar62 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar200 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar200 = vinsertps_avx(auVar200,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar88 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar62 + 6));
  auVar110._0_4_ = fVar109 * auVar88._0_4_;
  auVar110._4_4_ = fVar109 * auVar88._4_4_;
  auVar110._8_4_ = fVar109 * auVar88._8_4_;
  auVar110._12_4_ = fVar109 * auVar88._12_4_;
  auVar251._0_4_ = fVar109 * auVar200._0_4_;
  auVar251._4_4_ = fVar109 * auVar200._4_4_;
  auVar251._8_4_ = fVar109 * auVar200._8_4_;
  auVar251._12_4_ = fVar109 * auVar200._12_4_;
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar273 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xf + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar61 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1a + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1b + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1c + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar122 = vshufps_avx(auVar251,auVar251,0);
  auVar250 = vshufps_avx(auVar251,auVar251,0x55);
  auVar15 = vshufps_avx(auVar251,auVar251,0xaa);
  fVar109 = auVar15._0_4_;
  fVar69 = auVar15._4_4_;
  fVar106 = auVar15._8_4_;
  fVar107 = auVar15._12_4_;
  fVar192 = auVar250._0_4_;
  fVar215 = auVar250._4_4_;
  fVar217 = auVar250._8_4_;
  fVar219 = auVar250._12_4_;
  fVar171 = auVar122._0_4_;
  fVar186 = auVar122._4_4_;
  fVar188 = auVar122._8_4_;
  fVar190 = auVar122._12_4_;
  auVar321._0_4_ = fVar171 * auVar88._0_4_ + fVar192 * auVar200._0_4_ + fVar109 * auVar166._0_4_;
  auVar321._4_4_ = fVar186 * auVar88._4_4_ + fVar215 * auVar200._4_4_ + fVar69 * auVar166._4_4_;
  auVar321._8_4_ = fVar188 * auVar88._8_4_ + fVar217 * auVar200._8_4_ + fVar106 * auVar166._8_4_;
  auVar321._12_4_ = fVar190 * auVar88._12_4_ + fVar219 * auVar200._12_4_ + fVar107 * auVar166._12_4_
  ;
  auVar335._0_4_ = fVar171 * auVar273._0_4_ + fVar192 * auVar14._0_4_ + auVar150._0_4_ * fVar109;
  auVar335._4_4_ = fVar186 * auVar273._4_4_ + fVar215 * auVar14._4_4_ + auVar150._4_4_ * fVar69;
  auVar335._8_4_ = fVar188 * auVar273._8_4_ + fVar217 * auVar14._8_4_ + auVar150._8_4_ * fVar106;
  auVar335._12_4_ = fVar190 * auVar273._12_4_ + fVar219 * auVar14._12_4_ + auVar150._12_4_ * fVar107
  ;
  auVar252._0_4_ = fVar171 * auVar132._0_4_ + fVar192 * auVar121._0_4_ + auVar156._0_4_ * fVar109;
  auVar252._4_4_ = fVar186 * auVar132._4_4_ + fVar215 * auVar121._4_4_ + auVar156._4_4_ * fVar69;
  auVar252._8_4_ = fVar188 * auVar132._8_4_ + fVar217 * auVar121._8_4_ + auVar156._8_4_ * fVar106;
  auVar252._12_4_ =
       fVar190 * auVar132._12_4_ + fVar219 * auVar121._12_4_ + auVar156._12_4_ * fVar107;
  auVar122 = vshufps_avx(auVar110,auVar110,0);
  auVar250 = vshufps_avx(auVar110,auVar110,0x55);
  auVar15 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar109 = auVar15._0_4_;
  fVar69 = auVar15._4_4_;
  fVar106 = auVar15._8_4_;
  fVar107 = auVar15._12_4_;
  fVar192 = auVar250._0_4_;
  fVar215 = auVar250._4_4_;
  fVar217 = auVar250._8_4_;
  fVar219 = auVar250._12_4_;
  fVar171 = auVar122._0_4_;
  fVar186 = auVar122._4_4_;
  fVar188 = auVar122._8_4_;
  fVar190 = auVar122._12_4_;
  auVar111._0_4_ = fVar171 * auVar88._0_4_ + fVar192 * auVar200._0_4_ + fVar109 * auVar166._0_4_;
  auVar111._4_4_ = fVar186 * auVar88._4_4_ + fVar215 * auVar200._4_4_ + fVar69 * auVar166._4_4_;
  auVar111._8_4_ = fVar188 * auVar88._8_4_ + fVar217 * auVar200._8_4_ + fVar106 * auVar166._8_4_;
  auVar111._12_4_ = fVar190 * auVar88._12_4_ + fVar219 * auVar200._12_4_ + fVar107 * auVar166._12_4_
  ;
  auVar70._0_4_ = fVar171 * auVar273._0_4_ + auVar150._0_4_ * fVar109 + fVar192 * auVar14._0_4_;
  auVar70._4_4_ = fVar186 * auVar273._4_4_ + auVar150._4_4_ * fVar69 + fVar215 * auVar14._4_4_;
  auVar70._8_4_ = fVar188 * auVar273._8_4_ + auVar150._8_4_ * fVar106 + fVar217 * auVar14._8_4_;
  auVar70._12_4_ = fVar190 * auVar273._12_4_ + auVar150._12_4_ * fVar107 + fVar219 * auVar14._12_4_;
  auVar264._8_4_ = 0x7fffffff;
  auVar264._0_8_ = 0x7fffffff7fffffff;
  auVar264._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar321,auVar264);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar88 = vcmpps_avx(auVar88,auVar194,1);
  auVar200 = vblendvps_avx(auVar321,auVar194,auVar88);
  auVar88 = vandps_avx(auVar335,auVar264);
  auVar88 = vcmpps_avx(auVar88,auVar194,1);
  auVar166 = vblendvps_avx(auVar335,auVar194,auVar88);
  auVar88 = vandps_avx(auVar264,auVar252);
  auVar88 = vcmpps_avx(auVar88,auVar194,1);
  auVar88 = vblendvps_avx(auVar252,auVar194,auVar88);
  auVar142._0_4_ = fVar171 * auVar132._0_4_ + fVar192 * auVar121._0_4_ + auVar156._0_4_ * fVar109;
  auVar142._4_4_ = fVar186 * auVar132._4_4_ + fVar215 * auVar121._4_4_ + auVar156._4_4_ * fVar69;
  auVar142._8_4_ = fVar188 * auVar132._8_4_ + fVar217 * auVar121._8_4_ + auVar156._8_4_ * fVar106;
  auVar142._12_4_ =
       fVar190 * auVar132._12_4_ + fVar219 * auVar121._12_4_ + auVar156._12_4_ * fVar107;
  auVar273 = vrcpps_avx(auVar200);
  fVar171 = auVar273._0_4_;
  auVar173._0_4_ = fVar171 * auVar200._0_4_;
  fVar186 = auVar273._4_4_;
  auVar173._4_4_ = fVar186 * auVar200._4_4_;
  fVar188 = auVar273._8_4_;
  auVar173._8_4_ = fVar188 * auVar200._8_4_;
  fVar190 = auVar273._12_4_;
  auVar173._12_4_ = fVar190 * auVar200._12_4_;
  auVar265._8_4_ = 0x3f800000;
  auVar265._0_8_ = 0x3f8000003f800000;
  auVar265._12_4_ = 0x3f800000;
  auVar200 = vsubps_avx(auVar265,auVar173);
  fVar171 = fVar171 + fVar171 * auVar200._0_4_;
  fVar186 = fVar186 + fVar186 * auVar200._4_4_;
  fVar188 = fVar188 + fVar188 * auVar200._8_4_;
  fVar190 = fVar190 + fVar190 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar166);
  fVar192 = auVar200._0_4_;
  auVar222._0_4_ = fVar192 * auVar166._0_4_;
  fVar215 = auVar200._4_4_;
  auVar222._4_4_ = fVar215 * auVar166._4_4_;
  fVar217 = auVar200._8_4_;
  auVar222._8_4_ = fVar217 * auVar166._8_4_;
  fVar219 = auVar200._12_4_;
  auVar222._12_4_ = fVar219 * auVar166._12_4_;
  auVar200 = vsubps_avx(auVar265,auVar222);
  fVar192 = fVar192 + fVar192 * auVar200._0_4_;
  fVar215 = fVar215 + fVar215 * auVar200._4_4_;
  fVar217 = fVar217 + fVar217 * auVar200._8_4_;
  fVar219 = fVar219 + fVar219 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar88);
  fVar221 = auVar200._0_4_;
  auVar238._0_4_ = fVar221 * auVar88._0_4_;
  fVar234 = auVar200._4_4_;
  auVar238._4_4_ = fVar234 * auVar88._4_4_;
  fVar235 = auVar200._8_4_;
  auVar238._8_4_ = fVar235 * auVar88._8_4_;
  fVar236 = auVar200._12_4_;
  auVar238._12_4_ = fVar236 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar265,auVar238);
  fVar221 = fVar221 + fVar221 * auVar88._0_4_;
  fVar234 = fVar234 + fVar234 * auVar88._4_4_;
  fVar235 = fVar235 + fVar235 * auVar88._8_4_;
  fVar236 = fVar236 + fVar236 * auVar88._12_4_;
  auVar88 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar62 + 0x16)) *
                          *(float *)(prim + lVar62 + 0x1a)));
  auVar166 = vshufps_avx(auVar88,auVar88,0);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar200 = vpmovsxwd_avx(auVar200);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar273 = vsubps_avx(auVar200,auVar88);
  fVar109 = auVar166._0_4_;
  fVar69 = auVar166._4_4_;
  fVar106 = auVar166._8_4_;
  fVar107 = auVar166._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar200 = vpmovsxwd_avx(auVar166);
  auVar253._0_4_ = auVar273._0_4_ * fVar109 + auVar88._0_4_;
  auVar253._4_4_ = auVar273._4_4_ * fVar69 + auVar88._4_4_;
  auVar253._8_4_ = auVar273._8_4_ * fVar106 + auVar88._8_4_;
  auVar253._12_4_ = auVar273._12_4_ * fVar107 + auVar88._12_4_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar166 = vpmovsxwd_avx(auVar273);
  auVar88 = vcvtdq2ps_avx(auVar200);
  auVar200 = vcvtdq2ps_avx(auVar166);
  auVar200 = vsubps_avx(auVar200,auVar88);
  auVar266._0_4_ = auVar200._0_4_ * fVar109 + auVar88._0_4_;
  auVar266._4_4_ = auVar200._4_4_ * fVar69 + auVar88._4_4_;
  auVar266._8_4_ = auVar200._8_4_ * fVar106 + auVar88._8_4_;
  auVar266._12_4_ = auVar200._12_4_ * fVar107 + auVar88._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar88 = vpmovsxwd_avx(auVar14);
  uVar63 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar61 * 2 + uVar63 + 6);
  auVar200 = vpmovsxwd_avx(auVar150);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar88);
  auVar288._0_4_ = auVar200._0_4_ * fVar109 + auVar88._0_4_;
  auVar288._4_4_ = auVar200._4_4_ * fVar69 + auVar88._4_4_;
  auVar288._8_4_ = auVar200._8_4_ * fVar106 + auVar88._8_4_;
  auVar288._12_4_ = auVar200._12_4_ * fVar107 + auVar88._12_4_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar63 + 6);
  auVar88 = vpmovsxwd_avx(auVar132);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar61 * 0x18 + 6);
  auVar200 = vpmovsxwd_avx(auVar121);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar166 = vsubps_avx(auVar200,auVar88);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar61 * 0x1d + 6);
  auVar200 = vpmovsxwd_avx(auVar156);
  auVar304._0_4_ = auVar166._0_4_ * fVar109 + auVar88._0_4_;
  auVar304._4_4_ = auVar166._4_4_ * fVar69 + auVar88._4_4_;
  auVar304._8_4_ = auVar166._8_4_ * fVar106 + auVar88._8_4_;
  auVar304._12_4_ = auVar166._12_4_ * fVar107 + auVar88._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar200);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar200 = vpmovsxwd_avx(auVar122);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar88);
  auVar313._0_4_ = auVar200._0_4_ * fVar109 + auVar88._0_4_;
  auVar313._4_4_ = auVar200._4_4_ * fVar69 + auVar88._4_4_;
  auVar313._8_4_ = auVar200._8_4_ * fVar106 + auVar88._8_4_;
  auVar313._12_4_ = auVar200._12_4_ * fVar107 + auVar88._12_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar61) + 6);
  auVar88 = vpmovsxwd_avx(auVar250);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar61 * 0x23 + 6);
  auVar200 = vpmovsxwd_avx(auVar15);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar200 = vsubps_avx(auVar200,auVar88);
  auVar239._0_4_ = auVar88._0_4_ + auVar200._0_4_ * fVar109;
  auVar239._4_4_ = auVar88._4_4_ + auVar200._4_4_ * fVar69;
  auVar239._8_4_ = auVar88._8_4_ + auVar200._8_4_ * fVar106;
  auVar239._12_4_ = auVar88._12_4_ + auVar200._12_4_ * fVar107;
  auVar88 = vsubps_avx(auVar253,auVar111);
  auVar254._0_4_ = fVar171 * auVar88._0_4_;
  auVar254._4_4_ = fVar186 * auVar88._4_4_;
  auVar254._8_4_ = fVar188 * auVar88._8_4_;
  auVar254._12_4_ = fVar190 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar266,auVar111);
  auVar112._0_4_ = fVar171 * auVar88._0_4_;
  auVar112._4_4_ = fVar186 * auVar88._4_4_;
  auVar112._8_4_ = fVar188 * auVar88._8_4_;
  auVar112._12_4_ = fVar190 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar288,auVar70);
  auVar174._0_4_ = fVar192 * auVar88._0_4_;
  auVar174._4_4_ = fVar215 * auVar88._4_4_;
  auVar174._8_4_ = fVar217 * auVar88._8_4_;
  auVar174._12_4_ = fVar219 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar304,auVar70);
  auVar71._0_4_ = fVar192 * auVar88._0_4_;
  auVar71._4_4_ = fVar215 * auVar88._4_4_;
  auVar71._8_4_ = fVar217 * auVar88._8_4_;
  auVar71._12_4_ = fVar219 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar313,auVar142);
  auVar195._0_4_ = fVar221 * auVar88._0_4_;
  auVar195._4_4_ = fVar234 * auVar88._4_4_;
  auVar195._8_4_ = fVar235 * auVar88._8_4_;
  auVar195._12_4_ = fVar236 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar239,auVar142);
  auVar143._0_4_ = fVar221 * auVar88._0_4_;
  auVar143._4_4_ = fVar234 * auVar88._4_4_;
  auVar143._8_4_ = fVar235 * auVar88._8_4_;
  auVar143._12_4_ = fVar236 * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar254,auVar112);
  auVar200 = vpminsd_avx(auVar174,auVar71);
  auVar88 = vmaxps_avx(auVar88,auVar200);
  auVar200 = vpminsd_avx(auVar195,auVar143);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar267._4_4_ = uVar5;
  auVar267._0_4_ = uVar5;
  auVar267._8_4_ = uVar5;
  auVar267._12_4_ = uVar5;
  auVar200 = vmaxps_avx(auVar200,auVar267);
  auVar88 = vmaxps_avx(auVar88,auVar200);
  local_2f8._0_4_ = auVar88._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar88._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar88._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar88._12_4_ * 0.99999964;
  auVar88 = vpmaxsd_avx(auVar254,auVar112);
  auVar200 = vpmaxsd_avx(auVar174,auVar71);
  auVar88 = vminps_avx(auVar88,auVar200);
  auVar200 = vpmaxsd_avx(auVar195,auVar143);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar5;
  auVar144._0_4_ = uVar5;
  auVar144._8_4_ = uVar5;
  auVar144._12_4_ = uVar5;
  auVar200 = vminps_avx(auVar200,auVar144);
  auVar88 = vminps_avx(auVar88,auVar200);
  auVar72._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar88 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar200 = vpcmpgtd_avx(auVar88,_DAT_01f7fcf0);
  auVar88 = vcmpps_avx(local_2f8,auVar72,2);
  auVar88 = vandps_avx(auVar88,auVar200);
  uVar59 = vmovmskps_avx(auVar88);
  if (uVar59 == 0) {
    uVar61 = 0;
LAB_00fbb0c6:
    return (bool)((byte)uVar61 & 1);
  }
  uVar59 = uVar59 & 0xff;
  auVar100._16_16_ = mm_lookupmask_ps._240_16_;
  auVar100._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar100,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_440 = prim;
LAB_00fb8d8e:
  lVar62 = 0;
  if (uVar59 != 0) {
    for (; (uVar59 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  uVar60 = *(uint *)(local_440 + 2);
  pGVar8 = (context->scene->geometries).items[uVar60].ptr;
  fVar109 = (pGVar8->time_range).lower;
  fVar109 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar109) / ((pGVar8->time_range).upper - fVar109));
  auVar88 = vroundss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),9);
  auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_440 + lVar62 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)auVar88._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar67);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar67);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar61);
  fVar69 = *pfVar4;
  fVar106 = pfVar4[1];
  fVar107 = pfVar4[2];
  fVar171 = pfVar4[3];
  lVar1 = uVar61 + 1;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar186 = *pfVar4;
  fVar188 = pfVar4[1];
  fVar190 = pfVar4[2];
  fVar192 = pfVar4[3];
  lVar2 = uVar61 + 2;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar215 = *pfVar4;
  fVar217 = pfVar4[1];
  fVar219 = pfVar4[2];
  fVar221 = pfVar4[3];
  lVar3 = uVar61 + 3;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar234 = *pfVar4;
  fVar235 = pfVar4[1];
  fVar236 = pfVar4[2];
  fVar108 = pfVar4[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar67);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar67);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar61);
  fVar172 = *pfVar4;
  fVar187 = pfVar4[1];
  fVar189 = pfVar4[2];
  fVar191 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar193 = *pfVar4;
  fVar216 = pfVar4[1];
  fVar218 = pfVar4[2];
  fVar220 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar237 = *pfVar4;
  fVar262 = pfVar4[1];
  fVar263 = pfVar4[2];
  fVar282 = pfVar4[3];
  fVar109 = fVar109 - auVar88._0_4_;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar283 = *pfVar4;
  fVar320 = pfVar4[1];
  fVar284 = pfVar4[2];
  fVar328 = pfVar4[3];
  auVar73._0_4_ = fVar186 * 0.0 + fVar215 * 0.5 + fVar234 * 0.0;
  auVar73._4_4_ = fVar188 * 0.0 + fVar217 * 0.5 + fVar235 * 0.0;
  auVar73._8_4_ = fVar190 * 0.0 + fVar219 * 0.5 + fVar236 * 0.0;
  auVar73._12_4_ = fVar192 * 0.0 + fVar221 * 0.5 + fVar108 * 0.0;
  auVar145._0_4_ = fVar69 * 0.5;
  auVar145._4_4_ = fVar106 * 0.5;
  auVar145._8_4_ = fVar107 * 0.5;
  auVar145._12_4_ = fVar171 * 0.5;
  auVar121 = vsubps_avx(auVar73,auVar145);
  auVar74._0_4_ = fVar193 * 0.0 + fVar237 * 0.5 + fVar283 * 0.0;
  auVar74._4_4_ = fVar216 * 0.0 + fVar262 * 0.5 + fVar320 * 0.0;
  auVar74._8_4_ = fVar218 * 0.0 + fVar263 * 0.5 + fVar284 * 0.0;
  auVar74._12_4_ = fVar220 * 0.0 + fVar282 * 0.5 + fVar328 * 0.0;
  auVar342._0_4_ = fVar172 * 0.5;
  auVar342._4_4_ = fVar187 * 0.5;
  auVar342._8_4_ = fVar189 * 0.5;
  auVar342._12_4_ = fVar191 * 0.5;
  auVar273 = vsubps_avx(auVar74,auVar342);
  local_5a8._0_4_ = fVar69 * -0.0 + fVar215 * 0.0 + fVar234 * -0.0 + fVar186;
  local_5a8._4_4_ = fVar106 * -0.0 + fVar217 * 0.0 + fVar235 * -0.0 + fVar188;
  fStack_5a0 = fVar107 * -0.0 + fVar219 * 0.0 + fVar236 * -0.0 + fVar190;
  fStack_59c = fVar171 * -0.0 + fVar221 * 0.0 + fVar108 * -0.0 + fVar192;
  local_5d8._0_4_ = fVar69 * -0.0 + fVar186 * 0.0 + fVar215 + fVar234 * -0.0;
  local_5d8._4_4_ = fVar106 * -0.0 + fVar188 * 0.0 + fVar217 + fVar235 * -0.0;
  fStack_5d0 = fVar107 * -0.0 + fVar190 * 0.0 + fVar219 + fVar236 * -0.0;
  fStack_5cc = fVar171 * -0.0 + fVar192 * 0.0 + fVar221 + fVar108 * -0.0;
  auVar268._0_4_ = fVar215 * 0.0 + fVar234 * 0.5;
  auVar268._4_4_ = fVar217 * 0.0 + fVar235 * 0.5;
  auVar268._8_4_ = fVar219 * 0.0 + fVar236 * 0.5;
  auVar268._12_4_ = fVar221 * 0.0 + fVar108 * 0.5;
  auVar196._0_4_ = fVar186 * 0.5;
  auVar196._4_4_ = fVar188 * 0.5;
  auVar196._8_4_ = fVar190 * 0.5;
  auVar196._12_4_ = fVar192 * 0.5;
  auVar88 = vsubps_avx(auVar268,auVar196);
  auVar348._0_4_ = fVar172 * -0.0 + fVar237 * 0.0 + fVar283 * -0.0 + fVar193;
  auVar348._4_4_ = fVar187 * -0.0 + fVar262 * 0.0 + fVar320 * -0.0 + fVar216;
  auVar348._8_4_ = fVar189 * -0.0 + fVar263 * 0.0 + fVar284 * -0.0 + fVar218;
  auVar348._12_4_ = fVar191 * -0.0 + fVar282 * 0.0 + fVar328 * -0.0 + fVar220;
  auVar289._0_4_ = fVar69 * 0.0 + auVar88._0_4_;
  auVar289._4_4_ = fVar106 * 0.0 + auVar88._4_4_;
  auVar289._8_4_ = fVar107 * 0.0 + auVar88._8_4_;
  auVar289._12_4_ = fVar171 * 0.0 + auVar88._12_4_;
  auVar175._0_4_ = fVar172 * -0.0 + fVar193 * 0.0 + fVar237 + fVar283 * -0.0;
  auVar175._4_4_ = fVar187 * -0.0 + fVar216 * 0.0 + fVar262 + fVar320 * -0.0;
  auVar175._8_4_ = fVar189 * -0.0 + fVar218 * 0.0 + fVar263 + fVar284 * -0.0;
  auVar175._12_4_ = fVar191 * -0.0 + fVar220 * 0.0 + fVar282 + fVar328 * -0.0;
  auVar197._0_4_ = fVar237 * 0.0 + fVar283 * 0.5;
  auVar197._4_4_ = fVar262 * 0.0 + fVar320 * 0.5;
  auVar197._8_4_ = fVar263 * 0.0 + fVar284 * 0.5;
  auVar197._12_4_ = fVar282 * 0.0 + fVar328 * 0.5;
  auVar255._0_4_ = fVar193 * 0.5;
  auVar255._4_4_ = fVar216 * 0.5;
  auVar255._8_4_ = fVar218 * 0.5;
  auVar255._12_4_ = fVar220 * 0.5;
  auVar88 = vsubps_avx(auVar197,auVar255);
  auVar198._0_4_ = fVar172 * 0.0 + auVar88._0_4_;
  auVar198._4_4_ = fVar187 * 0.0 + auVar88._4_4_;
  auVar198._8_4_ = fVar189 * 0.0 + auVar88._8_4_;
  auVar198._12_4_ = fVar191 * 0.0 + auVar88._12_4_;
  auVar88 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar200 = vshufps_avx(auVar348,auVar348,0xc9);
  fVar285 = auVar121._0_4_;
  auVar223._0_4_ = fVar285 * auVar200._0_4_;
  fVar329 = auVar121._4_4_;
  auVar223._4_4_ = fVar329 * auVar200._4_4_;
  fVar286 = auVar121._8_4_;
  auVar223._8_4_ = fVar286 * auVar200._8_4_;
  fVar330 = auVar121._12_4_;
  auVar223._12_4_ = fVar330 * auVar200._12_4_;
  auVar269._0_4_ = auVar348._0_4_ * auVar88._0_4_;
  auVar269._4_4_ = auVar348._4_4_ * auVar88._4_4_;
  auVar269._8_4_ = auVar348._8_4_ * auVar88._8_4_;
  auVar269._12_4_ = auVar348._12_4_ * auVar88._12_4_;
  auVar200 = vsubps_avx(auVar269,auVar223);
  auVar166 = vshufps_avx(auVar200,auVar200,0xc9);
  auVar200 = vshufps_avx(auVar273,auVar273,0xc9);
  auVar270._0_4_ = auVar200._0_4_ * fVar285;
  auVar270._4_4_ = auVar200._4_4_ * fVar329;
  auVar270._8_4_ = auVar200._8_4_ * fVar286;
  auVar270._12_4_ = auVar200._12_4_ * fVar330;
  auVar75._0_4_ = auVar88._0_4_ * auVar273._0_4_;
  auVar75._4_4_ = auVar88._4_4_ * auVar273._4_4_;
  auVar75._8_4_ = auVar88._8_4_ * auVar273._8_4_;
  auVar75._12_4_ = auVar88._12_4_ * auVar273._12_4_;
  auVar88 = vsubps_avx(auVar75,auVar270);
  auVar273 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar200 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar88 = vshufps_avx(auVar175,auVar175,0xc9);
  auVar271._0_4_ = auVar289._0_4_ * auVar88._0_4_;
  auVar271._4_4_ = auVar289._4_4_ * auVar88._4_4_;
  auVar271._8_4_ = auVar289._8_4_ * auVar88._8_4_;
  auVar271._12_4_ = auVar289._12_4_ * auVar88._12_4_;
  auVar176._0_4_ = auVar200._0_4_ * auVar175._0_4_;
  auVar176._4_4_ = auVar200._4_4_ * auVar175._4_4_;
  auVar176._8_4_ = auVar200._8_4_ * auVar175._8_4_;
  auVar176._12_4_ = auVar200._12_4_ * auVar175._12_4_;
  auVar88 = vsubps_avx(auVar176,auVar271);
  auVar14 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar88 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar272._0_4_ = auVar289._0_4_ * auVar88._0_4_;
  auVar272._4_4_ = auVar289._4_4_ * auVar88._4_4_;
  auVar272._8_4_ = auVar289._8_4_ * auVar88._8_4_;
  auVar272._12_4_ = auVar289._12_4_ * auVar88._12_4_;
  auVar88 = vdpps_avx(auVar166,auVar166,0x7f);
  auVar199._0_4_ = auVar200._0_4_ * auVar198._0_4_;
  auVar199._4_4_ = auVar200._4_4_ * auVar198._4_4_;
  auVar199._8_4_ = auVar200._8_4_ * auVar198._8_4_;
  auVar199._12_4_ = auVar200._12_4_ * auVar198._12_4_;
  auVar200 = vsubps_avx(auVar199,auVar272);
  auVar150 = vshufps_avx(auVar200,auVar200,0xc9);
  fVar106 = auVar88._0_4_;
  auVar122 = ZEXT416((uint)fVar106);
  auVar200 = vrsqrtss_avx(auVar122,auVar122);
  fVar69 = auVar200._0_4_;
  auVar200 = ZEXT416((uint)(fVar69 * 1.5 - fVar106 * 0.5 * fVar69 * fVar69 * fVar69));
  auVar132 = vshufps_avx(auVar200,auVar200,0);
  auVar200 = vdpps_avx(auVar166,auVar273,0x7f);
  fVar193 = auVar132._0_4_ * auVar166._0_4_;
  fVar216 = auVar132._4_4_ * auVar166._4_4_;
  fVar218 = auVar132._8_4_ * auVar166._8_4_;
  fVar220 = auVar132._12_4_ * auVar166._12_4_;
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar76._0_4_ = auVar88._0_4_ * auVar273._0_4_;
  auVar76._4_4_ = auVar88._4_4_ * auVar273._4_4_;
  auVar76._8_4_ = auVar88._8_4_ * auVar273._8_4_;
  auVar76._12_4_ = auVar88._12_4_ * auVar273._12_4_;
  auVar88 = vshufps_avx(auVar200,auVar200,0);
  auVar224._0_4_ = auVar88._0_4_ * auVar166._0_4_;
  auVar224._4_4_ = auVar88._4_4_ * auVar166._4_4_;
  auVar224._8_4_ = auVar88._8_4_ * auVar166._8_4_;
  auVar224._12_4_ = auVar88._12_4_ * auVar166._12_4_;
  auVar156 = vsubps_avx(auVar76,auVar224);
  auVar88 = vrcpss_avx(auVar122,auVar122);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar106 * auVar88._0_4_)));
  auVar166 = vshufps_avx(auVar88,auVar88,0);
  auVar88 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar237 = auVar88._0_4_;
  auVar273 = ZEXT416((uint)fVar237);
  auVar200 = vrsqrtss_avx(auVar273,auVar273);
  fVar172 = auVar200._0_4_;
  auVar200 = vdpps_avx(auVar14,auVar150,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar349._0_4_ = auVar150._0_4_ * auVar88._0_4_;
  auVar349._4_4_ = auVar150._4_4_ * auVar88._4_4_;
  auVar349._8_4_ = auVar150._8_4_ * auVar88._8_4_;
  auVar349._12_4_ = auVar150._12_4_ * auVar88._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar67);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar67);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar61);
  fVar69 = *pfVar4;
  fVar106 = pfVar4[1];
  fVar107 = pfVar4[2];
  fVar171 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar186 = *pfVar4;
  fVar188 = pfVar4[1];
  fVar190 = pfVar4[2];
  fVar192 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar215 = *pfVar4;
  fVar217 = pfVar4[1];
  fVar219 = pfVar4[2];
  fVar221 = pfVar4[3];
  auVar88 = vshufps_avx(auVar200,auVar200,0);
  auVar77._0_4_ = auVar88._0_4_ * auVar14._0_4_;
  auVar77._4_4_ = auVar88._4_4_ * auVar14._4_4_;
  auVar77._8_4_ = auVar88._8_4_ * auVar14._8_4_;
  auVar77._12_4_ = auVar88._12_4_ * auVar14._12_4_;
  auVar150 = vsubps_avx(auVar349,auVar77);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar234 = *pfVar4;
  fVar235 = pfVar4[1];
  fVar236 = pfVar4[2];
  fVar108 = pfVar4[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar67);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar67);
  auVar88 = ZEXT416((uint)(fVar172 * 1.5 - fVar237 * 0.5 * fVar172 * fVar172 * fVar172));
  auVar200 = vshufps_avx(auVar88,auVar88,0);
  fVar172 = auVar200._0_4_ * auVar14._0_4_;
  fVar187 = auVar200._4_4_ * auVar14._4_4_;
  fVar189 = auVar200._8_4_ * auVar14._8_4_;
  fVar191 = auVar200._12_4_ * auVar14._12_4_;
  auVar88 = vrcpss_avx(auVar273,auVar273);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - auVar88._0_4_ * fVar237)));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar273 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar322._0_4_ = auVar273._0_4_ * fVar193;
  auVar322._4_4_ = auVar273._4_4_ * fVar216;
  auVar322._8_4_ = auVar273._8_4_ * fVar218;
  auVar322._12_4_ = auVar273._12_4_ * fVar220;
  auVar14 = vshufps_avx(auVar121,auVar121,0xff);
  auVar122 = vsubps_avx(_local_5a8,auVar322);
  auVar256._0_4_ =
       auVar14._0_4_ * fVar193 + auVar273._0_4_ * auVar132._0_4_ * auVar156._0_4_ * auVar166._0_4_;
  auVar256._4_4_ =
       auVar14._4_4_ * fVar216 + auVar273._4_4_ * auVar132._4_4_ * auVar156._4_4_ * auVar166._4_4_;
  auVar256._8_4_ =
       auVar14._8_4_ * fVar218 + auVar273._8_4_ * auVar132._8_4_ * auVar156._8_4_ * auVar166._8_4_;
  auVar256._12_4_ =
       auVar14._12_4_ * fVar220 +
       auVar273._12_4_ * auVar132._12_4_ * auVar156._12_4_ * auVar166._12_4_;
  auVar121 = vsubps_avx(auVar121,auVar256);
  local_5a8._0_4_ = auVar322._0_4_ + (float)local_5a8._0_4_;
  local_5a8._4_4_ = auVar322._4_4_ + (float)local_5a8._4_4_;
  fStack_5a0 = auVar322._8_4_ + fStack_5a0;
  fStack_59c = auVar322._12_4_ + fStack_59c;
  auVar166 = vshufps_avx(_local_5d8,_local_5d8,0xff);
  auVar146._0_4_ = auVar166._0_4_ * fVar172;
  auVar146._4_4_ = auVar166._4_4_ * fVar187;
  auVar146._8_4_ = auVar166._8_4_ * fVar189;
  auVar146._12_4_ = auVar166._12_4_ * fVar191;
  auVar273 = vshufps_avx(auVar289,auVar289,0xff);
  auVar156 = vsubps_avx(_local_5d8,auVar146);
  auVar78._0_4_ =
       auVar273._0_4_ * fVar172 + auVar166._0_4_ * auVar200._0_4_ * auVar150._0_4_ * auVar88._0_4_;
  auVar78._4_4_ =
       auVar273._4_4_ * fVar187 + auVar166._4_4_ * auVar200._4_4_ * auVar150._4_4_ * auVar88._4_4_;
  auVar78._8_4_ =
       auVar273._8_4_ * fVar189 + auVar166._8_4_ * auVar200._8_4_ * auVar150._8_4_ * auVar88._8_4_;
  auVar78._12_4_ =
       auVar273._12_4_ * fVar191 +
       auVar166._12_4_ * auVar200._12_4_ * auVar150._12_4_ * auVar88._12_4_;
  auVar250 = vsubps_avx(auVar289,auVar78);
  local_5d8._0_4_ = (float)local_5d8._0_4_ + auVar146._0_4_;
  local_5d8._4_4_ = (float)local_5d8._4_4_ + auVar146._4_4_;
  fStack_5d0 = fStack_5d0 + auVar146._8_4_;
  fStack_5cc = fStack_5cc + auVar146._12_4_;
  auVar79._0_4_ = fVar186 * 0.0 + fVar215 * 0.5 + fVar234 * 0.0;
  auVar79._4_4_ = fVar188 * 0.0 + fVar217 * 0.5 + fVar235 * 0.0;
  auVar79._8_4_ = fVar190 * 0.0 + fVar219 * 0.5 + fVar236 * 0.0;
  auVar79._12_4_ = fVar192 * 0.0 + fVar221 * 0.5 + fVar108 * 0.0;
  auVar113._0_4_ = fVar69 * 0.5;
  auVar113._4_4_ = fVar106 * 0.5;
  auVar113._8_4_ = fVar107 * 0.5;
  auVar113._12_4_ = fVar171 * 0.5;
  auVar15 = vsubps_avx(auVar79,auVar113);
  pfVar4 = (float *)(lVar11 + lVar2 * lVar10);
  fVar172 = *pfVar4;
  fVar187 = pfVar4[1];
  fVar189 = pfVar4[2];
  fVar191 = pfVar4[3];
  auVar88 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar3);
  fVar283 = auVar88._0_4_;
  fVar320 = auVar88._4_4_;
  fVar284 = auVar88._8_4_;
  fVar328 = auVar88._12_4_;
  pfVar4 = (float *)(lVar11 + lVar1 * lVar10);
  fVar193 = *pfVar4;
  fVar216 = pfVar4[1];
  fVar218 = pfVar4[2];
  fVar220 = pfVar4[3];
  auVar240._0_4_ = fVar193 * 0.0 + fVar283 * 0.0 + fVar172 * 0.5;
  auVar240._4_4_ = fVar216 * 0.0 + fVar320 * 0.0 + fVar187 * 0.5;
  auVar240._8_4_ = fVar218 * 0.0 + fVar284 * 0.0 + fVar189 * 0.5;
  auVar240._12_4_ = fVar220 * 0.0 + fVar328 * 0.0 + fVar191 * 0.5;
  pfVar4 = (float *)(lVar11 + uVar61 * lVar10);
  fVar237 = *pfVar4;
  fVar262 = pfVar4[1];
  fVar263 = pfVar4[2];
  fVar282 = pfVar4[3];
  auVar274._0_4_ = fVar237 * 0.5;
  auVar274._4_4_ = fVar262 * 0.5;
  auVar274._8_4_ = fVar263 * 0.5;
  auVar274._12_4_ = fVar282 * 0.5;
  auVar200 = vsubps_avx(auVar240,auVar274);
  auVar275._0_4_ = fVar69 * -0.0 + fVar186 + fVar215 * 0.0 + fVar234 * -0.0;
  auVar275._4_4_ = fVar106 * -0.0 + fVar188 + fVar217 * 0.0 + fVar235 * -0.0;
  auVar275._8_4_ = fVar107 * -0.0 + fVar190 + fVar219 * 0.0 + fVar236 * -0.0;
  auVar275._12_4_ = fVar171 * -0.0 + fVar192 + fVar221 * 0.0 + fVar108 * -0.0;
  auVar257._0_4_ = fVar69 * -0.0 + fVar186 * 0.0 + fVar215 + fVar234 * -0.0;
  auVar257._4_4_ = fVar106 * -0.0 + fVar188 * 0.0 + fVar217 + fVar235 * -0.0;
  auVar257._8_4_ = fVar107 * -0.0 + fVar190 * 0.0 + fVar219 + fVar236 * -0.0;
  auVar257._12_4_ = fVar171 * -0.0 + fVar192 * 0.0 + fVar221 + fVar108 * -0.0;
  auVar305._0_4_ = fVar215 * 0.0 + fVar234 * 0.5;
  auVar305._4_4_ = fVar217 * 0.0 + fVar235 * 0.5;
  auVar305._8_4_ = fVar219 * 0.0 + fVar236 * 0.5;
  auVar305._12_4_ = fVar221 * 0.0 + fVar108 * 0.5;
  auVar323._0_4_ = fVar186 * 0.5;
  auVar323._4_4_ = fVar188 * 0.5;
  auVar323._8_4_ = fVar190 * 0.5;
  auVar323._12_4_ = fVar192 * 0.5;
  auVar88 = vsubps_avx(auVar305,auVar323);
  auVar314._0_4_ = fVar69 * 0.0 + auVar88._0_4_;
  auVar314._4_4_ = fVar106 * 0.0 + auVar88._4_4_;
  auVar314._8_4_ = fVar107 * 0.0 + auVar88._8_4_;
  auVar314._12_4_ = fVar171 * 0.0 + auVar88._12_4_;
  auVar306._0_4_ = fVar237 * -0.0 + fVar193 + fVar283 * -0.0 + fVar172 * 0.0;
  auVar306._4_4_ = fVar262 * -0.0 + fVar216 + fVar320 * -0.0 + fVar187 * 0.0;
  auVar306._8_4_ = fVar263 * -0.0 + fVar218 + fVar284 * -0.0 + fVar189 * 0.0;
  auVar306._12_4_ = fVar282 * -0.0 + fVar220 + fVar328 * -0.0 + fVar191 * 0.0;
  auVar114._0_4_ = fVar237 * -0.0 + fVar283 * -0.0 + fVar172 + fVar193 * 0.0;
  auVar114._4_4_ = fVar262 * -0.0 + fVar320 * -0.0 + fVar187 + fVar216 * 0.0;
  auVar114._8_4_ = fVar263 * -0.0 + fVar284 * -0.0 + fVar189 + fVar218 * 0.0;
  auVar114._12_4_ = fVar282 * -0.0 + fVar328 * -0.0 + fVar191 + fVar220 * 0.0;
  auVar147._0_4_ = fVar172 * 0.0 + fVar283 * 0.5;
  auVar147._4_4_ = fVar187 * 0.0 + fVar320 * 0.5;
  auVar147._8_4_ = fVar189 * 0.0 + fVar284 * 0.5;
  auVar147._12_4_ = fVar191 * 0.0 + fVar328 * 0.5;
  auVar177._0_4_ = fVar193 * 0.5;
  auVar177._4_4_ = fVar216 * 0.5;
  auVar177._8_4_ = fVar218 * 0.5;
  auVar177._12_4_ = fVar220 * 0.5;
  auVar88 = vsubps_avx(auVar147,auVar177);
  auVar148._0_4_ = fVar237 * 0.0 + auVar88._0_4_;
  auVar148._4_4_ = fVar262 * 0.0 + auVar88._4_4_;
  auVar148._8_4_ = fVar263 * 0.0 + auVar88._8_4_;
  auVar148._12_4_ = fVar282 * 0.0 + auVar88._12_4_;
  auVar88 = vshufps_avx(auVar306,auVar306,0xc9);
  fVar215 = auVar15._0_4_;
  auVar80._0_4_ = fVar215 * auVar88._0_4_;
  fVar217 = auVar15._4_4_;
  auVar80._4_4_ = fVar217 * auVar88._4_4_;
  fVar219 = auVar15._8_4_;
  auVar80._8_4_ = fVar219 * auVar88._8_4_;
  fVar191 = auVar15._12_4_;
  auVar80._12_4_ = fVar191 * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar307._0_4_ = auVar306._0_4_ * auVar88._0_4_;
  auVar307._4_4_ = auVar306._4_4_ * auVar88._4_4_;
  auVar307._8_4_ = auVar306._8_4_ * auVar88._8_4_;
  auVar307._12_4_ = auVar306._12_4_ * auVar88._12_4_;
  auVar166 = vsubps_avx(auVar307,auVar80);
  auVar178._0_4_ = auVar88._0_4_ * auVar200._0_4_;
  auVar178._4_4_ = auVar88._4_4_ * auVar200._4_4_;
  auVar178._8_4_ = auVar88._8_4_ * auVar200._8_4_;
  auVar178._12_4_ = auVar88._12_4_ * auVar200._12_4_;
  auVar88 = vshufps_avx(auVar200,auVar200,0xc9);
  auVar241._0_4_ = fVar215 * auVar88._0_4_;
  auVar241._4_4_ = fVar217 * auVar88._4_4_;
  auVar241._8_4_ = fVar219 * auVar88._8_4_;
  auVar241._12_4_ = fVar191 * auVar88._12_4_;
  auVar273 = vsubps_avx(auVar178,auVar241);
  auVar88 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar242._0_4_ = auVar314._0_4_ * auVar88._0_4_;
  auVar242._4_4_ = auVar314._4_4_ * auVar88._4_4_;
  auVar242._8_4_ = auVar314._8_4_ * auVar88._8_4_;
  auVar242._12_4_ = auVar314._12_4_ * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar314,auVar314,0xc9);
  auVar115._0_4_ = auVar88._0_4_ * auVar114._0_4_;
  auVar115._4_4_ = auVar88._4_4_ * auVar114._4_4_;
  auVar115._8_4_ = auVar88._8_4_ * auVar114._8_4_;
  auVar115._12_4_ = auVar88._12_4_ * auVar114._12_4_;
  auVar14 = vsubps_avx(auVar115,auVar242);
  auVar166 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar243._0_4_ = auVar88._0_4_ * auVar148._0_4_;
  auVar243._4_4_ = auVar88._4_4_ * auVar148._4_4_;
  auVar243._8_4_ = auVar88._8_4_ * auVar148._8_4_;
  auVar243._12_4_ = auVar88._12_4_ * auVar148._12_4_;
  auVar88 = vshufps_avx(auVar148,auVar148,0xc9);
  auVar149._0_4_ = auVar314._0_4_ * auVar88._0_4_;
  auVar149._4_4_ = auVar314._4_4_ * auVar88._4_4_;
  auVar149._8_4_ = auVar314._8_4_ * auVar88._8_4_;
  auVar149._12_4_ = auVar314._12_4_ * auVar88._12_4_;
  auVar88 = vdpps_avx(auVar166,auVar166,0x7f);
  auVar132 = vsubps_avx(auVar243,auVar149);
  fVar106 = auVar88._0_4_;
  auVar150 = ZEXT416((uint)fVar106);
  auVar200 = vrsqrtss_avx(auVar150,auVar150);
  fVar69 = auVar200._0_4_;
  auVar200 = vshufps_avx(auVar273,auVar273,0xc9);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar324._0_4_ = auVar88._0_4_ * auVar200._0_4_;
  auVar324._4_4_ = auVar88._4_4_ * auVar200._4_4_;
  auVar324._8_4_ = auVar88._8_4_ * auVar200._8_4_;
  auVar324._12_4_ = auVar88._12_4_ * auVar200._12_4_;
  auVar88 = vdpps_avx(auVar166,auVar200,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar179._0_4_ = auVar88._0_4_ * auVar166._0_4_;
  auVar179._4_4_ = auVar88._4_4_ * auVar166._4_4_;
  auVar179._8_4_ = auVar88._8_4_ * auVar166._8_4_;
  auVar179._12_4_ = auVar88._12_4_ * auVar166._12_4_;
  auVar70 = vsubps_avx(auVar324,auVar179);
  auVar88 = vrcpss_avx(auVar150,auVar150);
  auVar88 = ZEXT416((uint)((2.0 - fVar106 * auVar88._0_4_) * auVar88._0_4_));
  auVar273 = vshufps_avx(auVar88,auVar88,0);
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar88 = ZEXT416((uint)(fVar69 * 1.5 - fVar106 * 0.5 * fVar69 * fVar69 * fVar69));
  auVar150 = vshufps_avx(auVar88,auVar88,0);
  fVar69 = auVar166._0_4_ * auVar150._0_4_;
  fVar106 = auVar166._4_4_ * auVar150._4_4_;
  fVar107 = auVar166._8_4_ * auVar150._8_4_;
  fVar171 = auVar166._12_4_ * auVar150._12_4_;
  auVar200 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar88 = vblendps_avx(auVar200,_DAT_01f7aa10,0xe);
  auVar166 = vrsqrtss_avx(auVar88,auVar88);
  fVar186 = auVar166._0_4_;
  auVar166 = vshufps_avx(auVar132,auVar132,0xc9);
  auVar132 = vshufps_avx(auVar200,auVar200,0);
  auVar336._0_4_ = auVar132._0_4_ * auVar166._0_4_;
  auVar336._4_4_ = auVar132._4_4_ * auVar166._4_4_;
  auVar336._8_4_ = auVar132._8_4_ * auVar166._8_4_;
  auVar336._12_4_ = auVar132._12_4_ * auVar166._12_4_;
  auVar166 = vdpps_avx(auVar14,auVar166,0x7f);
  auVar166 = vshufps_avx(auVar166,auVar166,0);
  auVar325._0_4_ = auVar166._0_4_ * auVar14._0_4_;
  auVar325._4_4_ = auVar166._4_4_ * auVar14._4_4_;
  auVar325._8_4_ = auVar166._8_4_ * auVar14._8_4_;
  auVar325._12_4_ = auVar166._12_4_ * auVar14._12_4_;
  auVar132 = vsubps_avx(auVar336,auVar325);
  auVar88 = vrcpss_avx(auVar88,auVar88);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - auVar200._0_4_ * auVar88._0_4_)));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar200 = ZEXT416((uint)(fVar186 * 1.5 - auVar200._0_4_ * 0.5 * fVar186 * fVar186 * fVar186));
  auVar200 = vshufps_avx(auVar200,auVar200,0);
  fVar186 = auVar14._0_4_ * auVar200._0_4_;
  fVar188 = auVar14._4_4_ * auVar200._4_4_;
  fVar190 = auVar14._8_4_ * auVar200._8_4_;
  fVar192 = auVar14._12_4_ * auVar200._12_4_;
  auVar166 = vshufps_avx(auVar15,auVar15,0xff);
  auVar14 = vshufps_avx(auVar275,auVar275,0xff);
  auVar81._0_4_ = auVar14._0_4_ * fVar69;
  auVar81._4_4_ = auVar14._4_4_ * fVar106;
  auVar81._8_4_ = auVar14._8_4_ * fVar107;
  auVar81._12_4_ = auVar14._12_4_ * fVar171;
  auVar116._0_4_ =
       auVar166._0_4_ * fVar69 + auVar14._0_4_ * auVar150._0_4_ * auVar70._0_4_ * auVar273._0_4_;
  auVar116._4_4_ =
       auVar166._4_4_ * fVar106 + auVar14._4_4_ * auVar150._4_4_ * auVar70._4_4_ * auVar273._4_4_;
  auVar116._8_4_ =
       auVar166._8_4_ * fVar107 + auVar14._8_4_ * auVar150._8_4_ * auVar70._8_4_ * auVar273._8_4_;
  auVar116._12_4_ =
       auVar166._12_4_ * fVar171 +
       auVar14._12_4_ * auVar150._12_4_ * auVar70._12_4_ * auVar273._12_4_;
  auVar14 = vsubps_avx(auVar275,auVar81);
  auVar150 = vsubps_avx(auVar15,auVar116);
  auVar166 = vshufps_avx(auVar314,auVar314,0xff);
  auVar273 = vshufps_avx(auVar257,auVar257,0xff);
  auVar180._0_4_ = auVar273._0_4_ * fVar186;
  auVar180._4_4_ = auVar273._4_4_ * fVar188;
  auVar180._8_4_ = auVar273._8_4_ * fVar190;
  auVar180._12_4_ = auVar273._12_4_ * fVar192;
  auVar117._0_4_ =
       auVar166._0_4_ * fVar186 + auVar273._0_4_ * auVar200._0_4_ * auVar132._0_4_ * auVar88._0_4_;
  auVar117._4_4_ =
       auVar166._4_4_ * fVar188 + auVar273._4_4_ * auVar200._4_4_ * auVar132._4_4_ * auVar88._4_4_;
  auVar117._8_4_ =
       auVar166._8_4_ * fVar190 + auVar273._8_4_ * auVar200._8_4_ * auVar132._8_4_ * auVar88._8_4_;
  auVar117._12_4_ =
       auVar166._12_4_ * fVar192 +
       auVar273._12_4_ * auVar200._12_4_ * auVar132._12_4_ * auVar88._12_4_;
  auVar166 = vsubps_avx(auVar257,auVar180);
  auVar337._0_4_ = auVar257._0_4_ + auVar180._0_4_;
  auVar337._4_4_ = auVar257._4_4_ + auVar180._4_4_;
  auVar337._8_4_ = auVar257._8_4_ + auVar180._8_4_;
  auVar337._12_4_ = auVar257._12_4_ + auVar180._12_4_;
  auVar273 = vsubps_avx(auVar314,auVar117);
  local_518 = auVar121._0_4_;
  fStack_514 = auVar121._4_4_;
  fStack_510 = auVar121._8_4_;
  fStack_50c = auVar121._12_4_;
  local_478 = auVar122._0_4_;
  fStack_474 = auVar122._4_4_;
  fStack_470 = auVar122._8_4_;
  fStack_46c = auVar122._12_4_;
  auVar88 = vshufps_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),0);
  auVar200 = vshufps_avx(ZEXT416((uint)(1.0 - fVar109)),ZEXT416((uint)(1.0 - fVar109)),0);
  fVar171 = auVar88._0_4_;
  fVar186 = auVar88._4_4_;
  fVar188 = auVar88._8_4_;
  fVar190 = auVar88._12_4_;
  fVar109 = auVar200._0_4_;
  fVar69 = auVar200._4_4_;
  fVar106 = auVar200._8_4_;
  fVar107 = auVar200._12_4_;
  local_3e8._0_4_ = fVar109 * local_478 + fVar171 * auVar14._0_4_;
  local_3e8._4_4_ = fVar69 * fStack_474 + fVar186 * auVar14._4_4_;
  fStack_3e0 = fVar106 * fStack_470 + fVar188 * auVar14._8_4_;
  fStack_3dc = fVar107 * fStack_46c + fVar190 * auVar14._12_4_;
  fVar221 = fVar109 * (local_478 + local_518 * 0.33333334) +
            fVar171 * (auVar14._0_4_ + auVar150._0_4_ * 0.33333334);
  fVar235 = fVar69 * (fStack_474 + fStack_514 * 0.33333334) +
            fVar186 * (auVar14._4_4_ + auVar150._4_4_ * 0.33333334);
  fVar108 = fVar106 * (fStack_470 + fStack_510 * 0.33333334) +
            fVar188 * (auVar14._8_4_ + auVar150._8_4_ * 0.33333334);
  fVar187 = fVar107 * (fStack_46c + fStack_50c * 0.33333334) +
            fVar190 * (auVar14._12_4_ + auVar150._12_4_ * 0.33333334);
  local_578 = auVar250._0_4_;
  fStack_574 = auVar250._4_4_;
  fStack_570 = auVar250._8_4_;
  fStack_56c = auVar250._12_4_;
  auVar181._0_4_ = local_578 * 0.33333334;
  auVar181._4_4_ = fStack_574 * 0.33333334;
  auVar181._8_4_ = fStack_570 * 0.33333334;
  auVar181._12_4_ = fStack_56c * 0.33333334;
  auVar88 = vsubps_avx(auVar156,auVar181);
  auVar244._0_4_ = (auVar289._0_4_ + auVar78._0_4_) * 0.33333334;
  auVar244._4_4_ = (auVar289._4_4_ + auVar78._4_4_) * 0.33333334;
  auVar244._8_4_ = (auVar289._8_4_ + auVar78._8_4_) * 0.33333334;
  auVar244._12_4_ = (auVar289._12_4_ + auVar78._12_4_) * 0.33333334;
  auVar200 = vsubps_avx(_local_5d8,auVar244);
  auVar151._0_4_ = auVar273._0_4_ * 0.33333334;
  auVar151._4_4_ = auVar273._4_4_ * 0.33333334;
  auVar151._8_4_ = auVar273._8_4_ * 0.33333334;
  auVar151._12_4_ = auVar273._12_4_ * 0.33333334;
  auVar273 = vsubps_avx(auVar166,auVar151);
  auVar308._0_4_ = (auVar314._0_4_ + auVar117._0_4_) * 0.33333334;
  auVar308._4_4_ = (auVar314._4_4_ + auVar117._4_4_) * 0.33333334;
  auVar308._8_4_ = (auVar314._8_4_ + auVar117._8_4_) * 0.33333334;
  auVar308._12_4_ = (auVar314._12_4_ + auVar117._12_4_) * 0.33333334;
  auVar14 = vsubps_avx(auVar337,auVar308);
  local_3f8._0_4_ = fVar109 * auVar88._0_4_ + fVar171 * auVar273._0_4_;
  local_3f8._4_4_ = fVar69 * auVar88._4_4_ + fVar186 * auVar273._4_4_;
  fStack_3f0 = fVar106 * auVar88._8_4_ + fVar188 * auVar273._8_4_;
  fStack_3ec = fVar107 * auVar88._12_4_ + fVar190 * auVar273._12_4_;
  fVar234 = fVar171 * auVar166._0_4_ + fVar109 * auVar156._0_4_;
  fVar236 = fVar186 * auVar166._4_4_ + fVar69 * auVar156._4_4_;
  fVar172 = fVar188 * auVar166._8_4_ + fVar106 * auVar156._8_4_;
  fVar189 = fVar190 * auVar166._12_4_ + fVar107 * auVar156._12_4_;
  local_408._0_4_ = (float)local_5a8._0_4_ * fVar109 + fVar171 * (auVar275._0_4_ + auVar81._0_4_);
  local_408._4_4_ = (float)local_5a8._4_4_ * fVar69 + fVar186 * (auVar275._4_4_ + auVar81._4_4_);
  fStack_400 = fStack_5a0 * fVar106 + fVar188 * (auVar275._8_4_ + auVar81._8_4_);
  fStack_3fc = fStack_59c * fVar107 + fVar190 * (auVar275._12_4_ + auVar81._12_4_);
  local_418._0_4_ =
       fVar109 * ((float)local_5a8._0_4_ + (fVar285 + auVar256._0_4_) * 0.33333334) +
       fVar171 * (auVar275._0_4_ + auVar81._0_4_ + (fVar215 + auVar116._0_4_) * 0.33333334);
  local_418._4_4_ =
       fVar69 * ((float)local_5a8._4_4_ + (fVar329 + auVar256._4_4_) * 0.33333334) +
       fVar186 * (auVar275._4_4_ + auVar81._4_4_ + (fVar217 + auVar116._4_4_) * 0.33333334);
  fStack_410 = fVar106 * (fStack_5a0 + (fVar286 + auVar256._8_4_) * 0.33333334) +
               fVar188 * (auVar275._8_4_ + auVar81._8_4_ + (fVar219 + auVar116._8_4_) * 0.33333334);
  fStack_40c = fVar107 * (fStack_59c + (fVar330 + auVar256._12_4_) * 0.33333334) +
               fVar190 * (auVar275._12_4_ + auVar81._12_4_ +
                         (fVar191 + auVar116._12_4_) * 0.33333334);
  local_428 = fVar109 * auVar200._0_4_ + fVar171 * auVar14._0_4_;
  fStack_424 = fVar69 * auVar200._4_4_ + fVar186 * auVar14._4_4_;
  fStack_420 = fVar106 * auVar200._8_4_ + fVar188 * auVar14._8_4_;
  fStack_41c = fVar107 * auVar200._12_4_ + fVar190 * auVar14._12_4_;
  local_438._0_4_ = (float)local_5d8._0_4_ * fVar109 + fVar171 * auVar337._0_4_;
  local_438._4_4_ = (float)local_5d8._4_4_ * fVar69 + fVar186 * auVar337._4_4_;
  fStack_430 = fStack_5d0 * fVar106 + fVar188 * auVar337._8_4_;
  fStack_42c = fStack_5cc * fVar107 + fVar190 * auVar337._12_4_;
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3e8,auVar88);
  auVar166 = vmovsldup_avx(local_268);
  auVar200 = vmovshdup_avx(local_268);
  auVar273 = vshufps_avx(local_268,local_268,0xaa);
  fVar109 = pre->ray_space[k].vx.field_0.m128[0];
  fVar69 = pre->ray_space[k].vx.field_0.m128[1];
  fVar106 = pre->ray_space[k].vx.field_0.m128[2];
  fVar107 = pre->ray_space[k].vx.field_0.m128[3];
  fVar171 = pre->ray_space[k].vy.field_0.m128[0];
  fVar186 = pre->ray_space[k].vy.field_0.m128[1];
  fVar188 = pre->ray_space[k].vy.field_0.m128[2];
  fVar190 = pre->ray_space[k].vy.field_0.m128[3];
  fVar192 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar217 = pre->ray_space[k].vz.field_0.m128[2];
  fVar219 = pre->ray_space[k].vz.field_0.m128[3];
  auVar326._0_4_ = fVar109 * auVar166._0_4_ + fVar171 * auVar200._0_4_ + fVar192 * auVar273._0_4_;
  auVar326._4_4_ = fVar69 * auVar166._4_4_ + fVar186 * auVar200._4_4_ + fVar215 * auVar273._4_4_;
  auVar326._8_4_ = fVar106 * auVar166._8_4_ + fVar188 * auVar200._8_4_ + fVar217 * auVar273._8_4_;
  auVar326._12_4_ =
       fVar107 * auVar166._12_4_ + fVar190 * auVar200._12_4_ + fVar219 * auVar273._12_4_;
  auVar56._4_4_ = fVar235;
  auVar56._0_4_ = fVar221;
  auVar56._8_4_ = fVar108;
  auVar56._12_4_ = fVar187;
  local_278 = vsubps_avx(auVar56,auVar88);
  auVar273 = vshufps_avx(local_278,local_278,0xaa);
  auVar200 = vmovshdup_avx(local_278);
  auVar166 = vmovsldup_avx(local_278);
  auVar118._0_4_ = fVar109 * auVar166._0_4_ + fVar171 * auVar200._0_4_ + fVar192 * auVar273._0_4_;
  auVar118._4_4_ = fVar69 * auVar166._4_4_ + fVar186 * auVar200._4_4_ + fVar215 * auVar273._4_4_;
  auVar118._8_4_ = fVar106 * auVar166._8_4_ + fVar188 * auVar200._8_4_ + fVar217 * auVar273._8_4_;
  auVar118._12_4_ =
       fVar107 * auVar166._12_4_ + fVar190 * auVar200._12_4_ + fVar219 * auVar273._12_4_;
  local_288 = vsubps_avx(_local_3f8,auVar88);
  auVar273 = vshufps_avx(local_288,local_288,0xaa);
  auVar200 = vmovshdup_avx(local_288);
  auVar166 = vmovsldup_avx(local_288);
  auVar338._0_4_ = fVar109 * auVar166._0_4_ + fVar171 * auVar200._0_4_ + fVar192 * auVar273._0_4_;
  auVar338._4_4_ = fVar69 * auVar166._4_4_ + fVar186 * auVar200._4_4_ + fVar215 * auVar273._4_4_;
  auVar338._8_4_ = fVar106 * auVar166._8_4_ + fVar188 * auVar200._8_4_ + fVar217 * auVar273._8_4_;
  auVar338._12_4_ =
       fVar107 * auVar166._12_4_ + fVar190 * auVar200._12_4_ + fVar219 * auVar273._12_4_;
  auVar54._4_4_ = fVar236;
  auVar54._0_4_ = fVar234;
  auVar54._8_4_ = fVar172;
  auVar54._12_4_ = fVar189;
  local_298 = vsubps_avx(auVar54,auVar88);
  auVar273 = vshufps_avx(local_298,local_298,0xaa);
  auVar200 = vmovshdup_avx(local_298);
  auVar166 = vmovsldup_avx(local_298);
  auVar258._0_4_ = auVar166._0_4_ * fVar109 + auVar200._0_4_ * fVar171 + fVar192 * auVar273._0_4_;
  auVar258._4_4_ = auVar166._4_4_ * fVar69 + auVar200._4_4_ * fVar186 + fVar215 * auVar273._4_4_;
  auVar258._8_4_ = auVar166._8_4_ * fVar106 + auVar200._8_4_ * fVar188 + fVar217 * auVar273._8_4_;
  auVar258._12_4_ =
       auVar166._12_4_ * fVar107 + auVar200._12_4_ * fVar190 + fVar219 * auVar273._12_4_;
  local_2a8 = vsubps_avx(_local_408,auVar88);
  auVar273 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar200 = vmovshdup_avx(local_2a8);
  auVar166 = vmovsldup_avx(local_2a8);
  auVar276._0_4_ = auVar166._0_4_ * fVar109 + auVar200._0_4_ * fVar171 + auVar273._0_4_ * fVar192;
  auVar276._4_4_ = auVar166._4_4_ * fVar69 + auVar200._4_4_ * fVar186 + auVar273._4_4_ * fVar215;
  auVar276._8_4_ = auVar166._8_4_ * fVar106 + auVar200._8_4_ * fVar188 + auVar273._8_4_ * fVar217;
  auVar276._12_4_ =
       auVar166._12_4_ * fVar107 + auVar200._12_4_ * fVar190 + auVar273._12_4_ * fVar219;
  local_2b8 = vsubps_avx(_local_418,auVar88);
  auVar273 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar200 = vmovshdup_avx(local_2b8);
  auVar166 = vmovsldup_avx(local_2b8);
  auVar290._0_4_ = auVar166._0_4_ * fVar109 + auVar200._0_4_ * fVar171 + auVar273._0_4_ * fVar192;
  auVar290._4_4_ = auVar166._4_4_ * fVar69 + auVar200._4_4_ * fVar186 + auVar273._4_4_ * fVar215;
  auVar290._8_4_ = auVar166._8_4_ * fVar106 + auVar200._8_4_ * fVar188 + auVar273._8_4_ * fVar217;
  auVar290._12_4_ =
       auVar166._12_4_ * fVar107 + auVar200._12_4_ * fVar190 + auVar273._12_4_ * fVar219;
  auVar58._4_4_ = fStack_424;
  auVar58._0_4_ = local_428;
  auVar58._8_4_ = fStack_420;
  auVar58._12_4_ = fStack_41c;
  local_2c8 = vsubps_avx(auVar58,auVar88);
  auVar273 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar200 = vmovshdup_avx(local_2c8);
  auVar166 = vmovsldup_avx(local_2c8);
  auVar309._0_4_ = auVar166._0_4_ * fVar109 + auVar200._0_4_ * fVar171 + auVar273._0_4_ * fVar192;
  auVar309._4_4_ = auVar166._4_4_ * fVar69 + auVar200._4_4_ * fVar186 + auVar273._4_4_ * fVar215;
  auVar309._8_4_ = auVar166._8_4_ * fVar106 + auVar200._8_4_ * fVar188 + auVar273._8_4_ * fVar217;
  auVar309._12_4_ =
       auVar166._12_4_ * fVar107 + auVar200._12_4_ * fVar190 + auVar273._12_4_ * fVar219;
  local_2d8 = vsubps_avx(_local_438,auVar88);
  auVar166 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar88 = vmovshdup_avx(local_2d8);
  auVar200 = vmovsldup_avx(local_2d8);
  auVar82._0_4_ = fVar109 * auVar200._0_4_ + fVar171 * auVar88._0_4_ + fVar192 * auVar166._0_4_;
  auVar82._4_4_ = fVar69 * auVar200._4_4_ + fVar186 * auVar88._4_4_ + fVar215 * auVar166._4_4_;
  auVar82._8_4_ = fVar106 * auVar200._8_4_ + fVar188 * auVar88._8_4_ + fVar217 * auVar166._8_4_;
  auVar82._12_4_ = fVar107 * auVar200._12_4_ + fVar190 * auVar88._12_4_ + fVar219 * auVar166._12_4_;
  auVar273 = vmovlhps_avx(auVar326,auVar276);
  auVar14 = vmovlhps_avx(auVar118,auVar290);
  auVar150 = vmovlhps_avx(auVar338,auVar309);
  _local_3c8 = vmovlhps_avx(auVar258,auVar82);
  auVar88 = vminps_avx(auVar273,auVar14);
  auVar200 = vminps_avx(auVar150,_local_3c8);
  auVar166 = vminps_avx(auVar88,auVar200);
  auVar88 = vmaxps_avx(auVar273,auVar14);
  auVar200 = vmaxps_avx(auVar150,_local_3c8);
  auVar88 = vmaxps_avx(auVar88,auVar200);
  auVar200 = vshufpd_avx(auVar166,auVar166,3);
  auVar166 = vminps_avx(auVar166,auVar200);
  auVar200 = vshufpd_avx(auVar88,auVar88,3);
  auVar200 = vmaxps_avx(auVar88,auVar200);
  auVar245._8_4_ = 0x7fffffff;
  auVar245._0_8_ = 0x7fffffff7fffffff;
  auVar245._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar166,auVar245);
  auVar200 = vandps_avx(auVar200,auVar245);
  auVar88 = vmaxps_avx(auVar88,auVar200);
  auVar200 = vmovshdup_avx(auVar88);
  auVar88 = vmaxss_avx(auVar200,auVar88);
  fVar109 = auVar88._0_4_ * 9.536743e-07;
  local_3d8 = ZEXT416((uint)fVar109);
  auVar88 = vshufps_avx(local_3d8,ZEXT416((uint)fVar109),0);
  local_78._16_16_ = auVar88;
  local_78._0_16_ = auVar88;
  auVar83._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
  auVar83._8_4_ = auVar88._8_4_ ^ 0x80000000;
  auVar83._12_4_ = auVar88._12_4_ ^ 0x80000000;
  local_228._16_16_ = auVar83;
  local_228._0_16_ = auVar83;
  local_308 = vpshufd_avx(ZEXT416(uVar60),0);
  local_318 = vpshufd_avx(ZEXT416(*(uint *)(local_440 + lVar62 * 4 + 6)),0);
  uVar61 = 0;
  uVar65 = 0;
  fVar109 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar14,auVar273);
  _local_248 = vsubps_avx(auVar150,auVar14);
  _local_258 = vsubps_avx(_local_3c8,auVar150);
  _local_328 = vsubps_avx(_local_408,_local_3e8);
  auVar57._4_4_ = fVar235;
  auVar57._0_4_ = fVar221;
  auVar57._8_4_ = fVar108;
  auVar57._12_4_ = fVar187;
  _local_338 = vsubps_avx(_local_418,auVar57);
  _local_348 = vsubps_avx(auVar58,_local_3f8);
  auVar55._4_4_ = fVar236;
  auVar55._0_4_ = fVar234;
  auVar55._8_4_ = fVar172;
  auVar55._12_4_ = fVar189;
  _local_358 = vsubps_avx(_local_438,auVar55);
  auVar84 = ZEXT816(0x3f80000000000000);
  local_2e8 = auVar84;
LAB_00fb99f8:
  do {
    auVar88 = vshufps_avx(auVar84,auVar84,0x50);
    auVar343._8_4_ = 0x3f800000;
    auVar343._0_8_ = 0x3f8000003f800000;
    auVar343._12_4_ = 0x3f800000;
    auVar347._16_4_ = 0x3f800000;
    auVar347._0_16_ = auVar343;
    auVar347._20_4_ = 0x3f800000;
    auVar347._24_4_ = 0x3f800000;
    auVar347._28_4_ = 0x3f800000;
    auVar200 = vsubps_avx(auVar343,auVar88);
    fVar69 = auVar88._0_4_;
    fVar106 = auVar88._4_4_;
    fVar107 = auVar88._8_4_;
    fVar171 = auVar88._12_4_;
    fVar186 = auVar200._0_4_;
    fVar188 = auVar200._4_4_;
    fVar190 = auVar200._8_4_;
    fVar192 = auVar200._12_4_;
    auVar182._0_4_ = auVar276._0_4_ * fVar69 + fVar186 * auVar326._0_4_;
    auVar182._4_4_ = auVar276._4_4_ * fVar106 + fVar188 * auVar326._4_4_;
    auVar182._8_4_ = auVar276._0_4_ * fVar107 + fVar190 * auVar326._0_4_;
    auVar182._12_4_ = auVar276._4_4_ * fVar171 + fVar192 * auVar326._4_4_;
    auVar152._0_4_ = auVar290._0_4_ * fVar69 + fVar186 * auVar118._0_4_;
    auVar152._4_4_ = auVar290._4_4_ * fVar106 + fVar188 * auVar118._4_4_;
    auVar152._8_4_ = auVar290._0_4_ * fVar107 + fVar190 * auVar118._0_4_;
    auVar152._12_4_ = auVar290._4_4_ * fVar171 + fVar192 * auVar118._4_4_;
    auVar259._0_4_ = auVar309._0_4_ * fVar69 + auVar338._0_4_ * fVar186;
    auVar259._4_4_ = auVar309._4_4_ * fVar106 + auVar338._4_4_ * fVar188;
    auVar259._8_4_ = auVar309._0_4_ * fVar107 + auVar338._0_4_ * fVar190;
    auVar259._12_4_ = auVar309._4_4_ * fVar171 + auVar338._4_4_ * fVar192;
    auVar201._0_4_ = auVar82._0_4_ * fVar69 + auVar258._0_4_ * fVar186;
    auVar201._4_4_ = auVar82._4_4_ * fVar106 + auVar258._4_4_ * fVar188;
    auVar201._8_4_ = auVar82._0_4_ * fVar107 + auVar258._0_4_ * fVar190;
    auVar201._12_4_ = auVar82._4_4_ * fVar171 + auVar258._4_4_ * fVar192;
    auVar88 = vmovshdup_avx(local_2e8);
    auVar200 = vshufps_avx(local_2e8,local_2e8,0);
    auVar296._16_16_ = auVar200;
    auVar296._0_16_ = auVar200;
    auVar166 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar101._16_16_ = auVar166;
    auVar101._0_16_ = auVar166;
    auVar100 = vsubps_avx(auVar101,auVar296);
    auVar166 = vshufps_avx(auVar182,auVar182,0);
    auVar132 = vshufps_avx(auVar182,auVar182,0x55);
    auVar121 = vshufps_avx(auVar152,auVar152,0);
    auVar156 = vshufps_avx(auVar152,auVar152,0x55);
    auVar122 = vshufps_avx(auVar259,auVar259,0);
    auVar250 = vshufps_avx(auVar259,auVar259,0x55);
    auVar15 = vshufps_avx(auVar201,auVar201,0);
    auVar70 = vshufps_avx(auVar201,auVar201,0x55);
    auVar88 = ZEXT416((uint)((auVar88._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar88 = vshufps_avx(auVar88,auVar88,0);
    auVar312._0_4_ = auVar200._0_4_ + auVar100._0_4_ * 0.0;
    auVar312._4_4_ = auVar200._4_4_ + auVar100._4_4_ * 0.14285715;
    auVar312._8_4_ = auVar200._8_4_ + auVar100._8_4_ * 0.2857143;
    auVar312._12_4_ = auVar200._12_4_ + auVar100._12_4_ * 0.42857146;
    auVar312._16_4_ = auVar200._0_4_ + auVar100._16_4_ * 0.5714286;
    auVar312._20_4_ = auVar200._4_4_ + auVar100._20_4_ * 0.71428573;
    auVar312._24_4_ = auVar200._8_4_ + auVar100._24_4_ * 0.8571429;
    auVar312._28_4_ = auVar200._12_4_ + auVar100._28_4_;
    auVar16 = vsubps_avx(auVar347,auVar312);
    fVar69 = auVar121._0_4_;
    fVar107 = auVar121._4_4_;
    fVar186 = auVar121._8_4_;
    fVar190 = auVar121._12_4_;
    fVar287 = auVar16._0_4_;
    fVar298 = auVar16._4_4_;
    fVar299 = auVar16._8_4_;
    fVar300 = auVar16._12_4_;
    fVar301 = auVar16._16_4_;
    fVar302 = auVar16._20_4_;
    fVar303 = auVar16._24_4_;
    fVar283 = auVar156._0_4_;
    fVar284 = auVar156._4_4_;
    fVar285 = auVar156._8_4_;
    fVar286 = auVar156._12_4_;
    fVar341 = auVar132._12_4_ + 1.0;
    fVar237 = auVar122._0_4_;
    fVar262 = auVar122._4_4_;
    fVar263 = auVar122._8_4_;
    fVar282 = auVar122._12_4_;
    fVar215 = fVar237 * auVar312._0_4_ + fVar287 * fVar69;
    fVar217 = fVar262 * auVar312._4_4_ + fVar298 * fVar107;
    fVar219 = fVar263 * auVar312._8_4_ + fVar299 * fVar186;
    fVar191 = fVar282 * auVar312._12_4_ + fVar300 * fVar190;
    fVar193 = fVar237 * auVar312._16_4_ + fVar301 * fVar69;
    fVar216 = fVar262 * auVar312._20_4_ + fVar302 * fVar107;
    fVar218 = fVar263 * auVar312._24_4_ + fVar303 * fVar186;
    fVar106 = auVar250._0_4_;
    fVar171 = auVar250._4_4_;
    fVar188 = auVar250._8_4_;
    fVar192 = auVar250._12_4_;
    fVar320 = fVar283 * fVar287 + auVar312._0_4_ * fVar106;
    fVar328 = fVar284 * fVar298 + auVar312._4_4_ * fVar171;
    fVar329 = fVar285 * fVar299 + auVar312._8_4_ * fVar188;
    fVar330 = fVar286 * fVar300 + auVar312._12_4_ * fVar192;
    fVar331 = fVar283 * fVar301 + auVar312._16_4_ * fVar106;
    fVar332 = fVar284 * fVar302 + auVar312._20_4_ * fVar171;
    fVar333 = fVar285 * fVar303 + auVar312._24_4_ * fVar188;
    fVar334 = fVar286 + fVar190;
    auVar200 = vshufps_avx(auVar182,auVar182,0xaa);
    auVar121 = vshufps_avx(auVar182,auVar182,0xff);
    fVar220 = fVar282 + 0.0;
    auVar156 = vshufps_avx(auVar152,auVar152,0xaa);
    auVar122 = vshufps_avx(auVar152,auVar152,0xff);
    auVar213._0_4_ =
         fVar287 * (auVar312._0_4_ * fVar69 + fVar287 * auVar166._0_4_) + auVar312._0_4_ * fVar215;
    auVar213._4_4_ =
         fVar298 * (auVar312._4_4_ * fVar107 + fVar298 * auVar166._4_4_) + auVar312._4_4_ * fVar217;
    auVar213._8_4_ =
         fVar299 * (auVar312._8_4_ * fVar186 + fVar299 * auVar166._8_4_) + auVar312._8_4_ * fVar219;
    auVar213._12_4_ =
         fVar300 * (auVar312._12_4_ * fVar190 + fVar300 * auVar166._12_4_) +
         auVar312._12_4_ * fVar191;
    auVar213._16_4_ =
         fVar301 * (auVar312._16_4_ * fVar69 + fVar301 * auVar166._0_4_) + auVar312._16_4_ * fVar193
    ;
    auVar213._20_4_ =
         fVar302 * (auVar312._20_4_ * fVar107 + fVar302 * auVar166._4_4_) +
         auVar312._20_4_ * fVar216;
    auVar213._24_4_ =
         fVar303 * (auVar312._24_4_ * fVar186 + fVar303 * auVar166._8_4_) +
         auVar312._24_4_ * fVar218;
    auVar213._28_4_ = auVar166._12_4_ + 1.0 + fVar192;
    auVar232._0_4_ =
         fVar287 * (fVar283 * auVar312._0_4_ + auVar132._0_4_ * fVar287) + auVar312._0_4_ * fVar320;
    auVar232._4_4_ =
         fVar298 * (fVar284 * auVar312._4_4_ + auVar132._4_4_ * fVar298) + auVar312._4_4_ * fVar328;
    auVar232._8_4_ =
         fVar299 * (fVar285 * auVar312._8_4_ + auVar132._8_4_ * fVar299) + auVar312._8_4_ * fVar329;
    auVar232._12_4_ =
         fVar300 * (fVar286 * auVar312._12_4_ + auVar132._12_4_ * fVar300) +
         auVar312._12_4_ * fVar330;
    auVar232._16_4_ =
         fVar301 * (fVar283 * auVar312._16_4_ + auVar132._0_4_ * fVar301) +
         auVar312._16_4_ * fVar331;
    auVar232._20_4_ =
         fVar302 * (fVar284 * auVar312._20_4_ + auVar132._4_4_ * fVar302) +
         auVar312._20_4_ * fVar332;
    auVar232._24_4_ =
         fVar303 * (fVar285 * auVar312._24_4_ + auVar132._8_4_ * fVar303) +
         auVar312._24_4_ * fVar333;
    auVar232._28_4_ = auVar70._12_4_ + fVar192;
    auVar102._0_4_ =
         fVar287 * fVar215 + auVar312._0_4_ * (fVar237 * fVar287 + auVar15._0_4_ * auVar312._0_4_);
    auVar102._4_4_ =
         fVar298 * fVar217 + auVar312._4_4_ * (fVar262 * fVar298 + auVar15._4_4_ * auVar312._4_4_);
    auVar102._8_4_ =
         fVar299 * fVar219 + auVar312._8_4_ * (fVar263 * fVar299 + auVar15._8_4_ * auVar312._8_4_);
    auVar102._12_4_ =
         fVar300 * fVar191 +
         auVar312._12_4_ * (fVar282 * fVar300 + auVar15._12_4_ * auVar312._12_4_);
    auVar102._16_4_ =
         fVar301 * fVar193 + auVar312._16_4_ * (fVar237 * fVar301 + auVar15._0_4_ * auVar312._16_4_)
    ;
    auVar102._20_4_ =
         fVar302 * fVar216 + auVar312._20_4_ * (fVar262 * fVar302 + auVar15._4_4_ * auVar312._20_4_)
    ;
    auVar102._24_4_ =
         fVar303 * fVar218 + auVar312._24_4_ * (fVar263 * fVar303 + auVar15._8_4_ * auVar312._24_4_)
    ;
    auVar102._28_4_ = fVar190 + 1.0 + fVar220;
    auVar319._0_4_ =
         fVar287 * fVar320 + auVar312._0_4_ * (auVar70._0_4_ * auVar312._0_4_ + fVar287 * fVar106);
    auVar319._4_4_ =
         fVar298 * fVar328 + auVar312._4_4_ * (auVar70._4_4_ * auVar312._4_4_ + fVar298 * fVar171);
    auVar319._8_4_ =
         fVar299 * fVar329 + auVar312._8_4_ * (auVar70._8_4_ * auVar312._8_4_ + fVar299 * fVar188);
    auVar319._12_4_ =
         fVar300 * fVar330 +
         auVar312._12_4_ * (auVar70._12_4_ * auVar312._12_4_ + fVar300 * fVar192);
    auVar319._16_4_ =
         fVar301 * fVar331 + auVar312._16_4_ * (auVar70._0_4_ * auVar312._16_4_ + fVar301 * fVar106)
    ;
    auVar319._20_4_ =
         fVar302 * fVar332 + auVar312._20_4_ * (auVar70._4_4_ * auVar312._20_4_ + fVar302 * fVar171)
    ;
    auVar319._24_4_ =
         fVar303 * fVar333 + auVar312._24_4_ * (auVar70._8_4_ * auVar312._24_4_ + fVar303 * fVar188)
    ;
    auVar319._28_4_ = fVar220 + fVar192 + 0.0;
    local_98._0_4_ = fVar287 * auVar213._0_4_ + auVar312._0_4_ * auVar102._0_4_;
    local_98._4_4_ = fVar298 * auVar213._4_4_ + auVar312._4_4_ * auVar102._4_4_;
    local_98._8_4_ = fVar299 * auVar213._8_4_ + auVar312._8_4_ * auVar102._8_4_;
    local_98._12_4_ = fVar300 * auVar213._12_4_ + auVar312._12_4_ * auVar102._12_4_;
    local_98._16_4_ = fVar301 * auVar213._16_4_ + auVar312._16_4_ * auVar102._16_4_;
    local_98._20_4_ = fVar302 * auVar213._20_4_ + auVar312._20_4_ * auVar102._20_4_;
    local_98._24_4_ = fVar303 * auVar213._24_4_ + auVar312._24_4_ * auVar102._24_4_;
    local_98._28_4_ = fVar334 + fVar192 + 0.0;
    auVar185._0_4_ = fVar287 * auVar232._0_4_ + auVar312._0_4_ * auVar319._0_4_;
    auVar185._4_4_ = fVar298 * auVar232._4_4_ + auVar312._4_4_ * auVar319._4_4_;
    auVar185._8_4_ = fVar299 * auVar232._8_4_ + auVar312._8_4_ * auVar319._8_4_;
    auVar185._12_4_ = fVar300 * auVar232._12_4_ + auVar312._12_4_ * auVar319._12_4_;
    auVar185._16_4_ = fVar301 * auVar232._16_4_ + auVar312._16_4_ * auVar319._16_4_;
    auVar185._20_4_ = fVar302 * auVar232._20_4_ + auVar312._20_4_ * auVar319._20_4_;
    auVar185._24_4_ = fVar303 * auVar232._24_4_ + auVar312._24_4_ * auVar319._24_4_;
    auVar185._28_4_ = fVar334 + fVar220;
    auVar17 = vsubps_avx(auVar102,auVar213);
    auVar100 = vsubps_avx(auVar319,auVar232);
    local_518 = auVar88._0_4_;
    fStack_514 = auVar88._4_4_;
    fStack_510 = auVar88._8_4_;
    fStack_50c = auVar88._12_4_;
    local_d8 = local_518 * auVar17._0_4_ * 3.0;
    fStack_d4 = fStack_514 * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_d4;
    auVar18._0_4_ = local_d8;
    fStack_d0 = fStack_510 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_d0;
    fStack_cc = fStack_50c * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_cc;
    fStack_c8 = local_518 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_c8;
    fStack_c4 = fStack_514 * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_c4;
    fStack_c0 = fStack_510 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_c0;
    auVar18._28_4_ = auVar17._28_4_;
    local_f8 = local_518 * auVar100._0_4_ * 3.0;
    fStack_f4 = fStack_514 * auVar100._4_4_ * 3.0;
    auVar19._4_4_ = fStack_f4;
    auVar19._0_4_ = local_f8;
    fStack_f0 = fStack_510 * auVar100._8_4_ * 3.0;
    auVar19._8_4_ = fStack_f0;
    fStack_ec = fStack_50c * auVar100._12_4_ * 3.0;
    auVar19._12_4_ = fStack_ec;
    fStack_e8 = local_518 * auVar100._16_4_ * 3.0;
    auVar19._16_4_ = fStack_e8;
    fStack_e4 = fStack_514 * auVar100._20_4_ * 3.0;
    auVar19._20_4_ = fStack_e4;
    fStack_e0 = fStack_510 * auVar100._24_4_ * 3.0;
    auVar19._24_4_ = fStack_e0;
    auVar19._28_4_ = fVar334;
    auVar18 = vsubps_avx(local_98,auVar18);
    auVar100 = vperm2f128_avx(auVar18,auVar18,1);
    auVar100 = vshufps_avx(auVar100,auVar18,0x30);
    auVar100 = vshufps_avx(auVar18,auVar100,0x29);
    auVar19 = vsubps_avx(auVar185,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar332 = auVar156._0_4_;
    fVar333 = auVar156._4_4_;
    fVar350 = auVar156._8_4_;
    fVar190 = auVar200._12_4_;
    fVar262 = auVar122._0_4_;
    fVar282 = auVar122._4_4_;
    fVar320 = auVar122._8_4_;
    fVar328 = auVar122._12_4_;
    auVar88 = vshufps_avx(auVar259,auVar259,0xaa);
    fVar69 = auVar88._0_4_;
    fVar107 = auVar88._4_4_;
    fVar186 = auVar88._8_4_;
    fVar192 = auVar88._12_4_;
    fVar219 = auVar312._0_4_ * fVar69 + fVar332 * fVar287;
    fVar191 = auVar312._4_4_ * fVar107 + fVar333 * fVar298;
    fVar193 = auVar312._8_4_ * fVar186 + fVar350 * fVar299;
    fVar216 = auVar312._12_4_ * fVar192 + auVar156._12_4_ * fVar300;
    fVar218 = auVar312._16_4_ * fVar69 + fVar332 * fVar301;
    fVar220 = auVar312._20_4_ * fVar107 + fVar333 * fVar302;
    fVar237 = auVar312._24_4_ * fVar186 + fVar350 * fVar303;
    auVar88 = vshufps_avx(auVar259,auVar259,0xff);
    fVar106 = auVar88._0_4_;
    fVar171 = auVar88._4_4_;
    fVar188 = auVar88._8_4_;
    fVar215 = auVar88._12_4_;
    fVar263 = auVar312._0_4_ * fVar106 + fVar262 * fVar287;
    fVar283 = auVar312._4_4_ * fVar171 + fVar282 * fVar298;
    fVar284 = auVar312._8_4_ * fVar188 + fVar320 * fVar299;
    fVar285 = auVar312._12_4_ * fVar215 + fVar328 * fVar300;
    fVar329 = auVar312._16_4_ * fVar106 + fVar262 * fVar301;
    fVar286 = auVar312._20_4_ * fVar171 + fVar282 * fVar302;
    fVar330 = auVar312._24_4_ * fVar188 + fVar320 * fVar303;
    auVar88 = vshufps_avx(auVar201,auVar201,0xaa);
    fVar331 = auVar88._12_4_ + fVar192;
    auVar166 = vshufps_avx(auVar201,auVar201,0xff);
    fVar217 = auVar166._12_4_;
    auVar103._0_4_ =
         fVar287 * (fVar332 * auVar312._0_4_ + fVar287 * auVar200._0_4_) + auVar312._0_4_ * fVar219;
    auVar103._4_4_ =
         fVar298 * (fVar333 * auVar312._4_4_ + fVar298 * auVar200._4_4_) + auVar312._4_4_ * fVar191;
    auVar103._8_4_ =
         fVar299 * (fVar350 * auVar312._8_4_ + fVar299 * auVar200._8_4_) + auVar312._8_4_ * fVar193;
    auVar103._12_4_ =
         fVar300 * (auVar156._12_4_ * auVar312._12_4_ + fVar300 * fVar190) +
         auVar312._12_4_ * fVar216;
    auVar103._16_4_ =
         fVar301 * (fVar332 * auVar312._16_4_ + fVar301 * auVar200._0_4_) +
         auVar312._16_4_ * fVar218;
    auVar103._20_4_ =
         fVar302 * (fVar333 * auVar312._20_4_ + fVar302 * auVar200._4_4_) +
         auVar312._20_4_ * fVar220;
    auVar103._24_4_ =
         fVar303 * (fVar350 * auVar312._24_4_ + fVar303 * auVar200._8_4_) +
         auVar312._24_4_ * fVar237;
    auVar103._28_4_ = auVar19._28_4_ + fVar190 + fVar217;
    auVar138._0_4_ =
         fVar287 * (fVar262 * auVar312._0_4_ + auVar121._0_4_ * fVar287) + auVar312._0_4_ * fVar263;
    auVar138._4_4_ =
         fVar298 * (fVar282 * auVar312._4_4_ + auVar121._4_4_ * fVar298) + auVar312._4_4_ * fVar283;
    auVar138._8_4_ =
         fVar299 * (fVar320 * auVar312._8_4_ + auVar121._8_4_ * fVar299) + auVar312._8_4_ * fVar284;
    auVar138._12_4_ =
         fVar300 * (fVar328 * auVar312._12_4_ + auVar121._12_4_ * fVar300) +
         auVar312._12_4_ * fVar285;
    auVar138._16_4_ =
         fVar301 * (fVar262 * auVar312._16_4_ + auVar121._0_4_ * fVar301) +
         auVar312._16_4_ * fVar329;
    auVar138._20_4_ =
         fVar302 * (fVar282 * auVar312._20_4_ + auVar121._4_4_ * fVar302) +
         auVar312._20_4_ * fVar286;
    auVar138._24_4_ =
         fVar303 * (fVar320 * auVar312._24_4_ + auVar121._8_4_ * fVar303) +
         auVar312._24_4_ * fVar330;
    auVar138._28_4_ = fVar190 + auVar18._28_4_ + fVar217;
    auVar18 = vperm2f128_avx(local_98,local_98,1);
    auVar18 = vshufps_avx(auVar18,local_98,0x30);
    auVar101 = vshufps_avx(local_98,auVar18,0x29);
    auVar233._0_4_ =
         auVar312._0_4_ * (auVar88._0_4_ * auVar312._0_4_ + fVar287 * fVar69) + fVar287 * fVar219;
    auVar233._4_4_ =
         auVar312._4_4_ * (auVar88._4_4_ * auVar312._4_4_ + fVar298 * fVar107) + fVar298 * fVar191;
    auVar233._8_4_ =
         auVar312._8_4_ * (auVar88._8_4_ * auVar312._8_4_ + fVar299 * fVar186) + fVar299 * fVar193;
    auVar233._12_4_ =
         auVar312._12_4_ * (auVar88._12_4_ * auVar312._12_4_ + fVar300 * fVar192) +
         fVar300 * fVar216;
    auVar233._16_4_ =
         auVar312._16_4_ * (auVar88._0_4_ * auVar312._16_4_ + fVar301 * fVar69) + fVar301 * fVar218;
    auVar233._20_4_ =
         auVar312._20_4_ * (auVar88._4_4_ * auVar312._20_4_ + fVar302 * fVar107) + fVar302 * fVar220
    ;
    auVar233._24_4_ =
         auVar312._24_4_ * (auVar88._8_4_ * auVar312._24_4_ + fVar303 * fVar186) + fVar303 * fVar237
    ;
    auVar233._28_4_ = fVar331 + fVar341 + auVar232._28_4_;
    auVar281._0_4_ =
         fVar287 * fVar263 + auVar312._0_4_ * (auVar312._0_4_ * auVar166._0_4_ + fVar287 * fVar106);
    auVar281._4_4_ =
         fVar298 * fVar283 + auVar312._4_4_ * (auVar312._4_4_ * auVar166._4_4_ + fVar298 * fVar171);
    auVar281._8_4_ =
         fVar299 * fVar284 + auVar312._8_4_ * (auVar312._8_4_ * auVar166._8_4_ + fVar299 * fVar188);
    auVar281._12_4_ =
         fVar300 * fVar285 + auVar312._12_4_ * (auVar312._12_4_ * fVar217 + fVar300 * fVar215);
    auVar281._16_4_ =
         fVar301 * fVar329 +
         auVar312._16_4_ * (auVar312._16_4_ * auVar166._0_4_ + fVar301 * fVar106);
    auVar281._20_4_ =
         fVar302 * fVar286 +
         auVar312._20_4_ * (auVar312._20_4_ * auVar166._4_4_ + fVar302 * fVar171);
    auVar281._24_4_ =
         fVar303 * fVar330 +
         auVar312._24_4_ * (auVar312._24_4_ * auVar166._8_4_ + fVar303 * fVar188);
    auVar281._28_4_ = fVar341 + fVar328 + fVar217 + fVar215;
    auVar261._0_4_ = fVar287 * auVar103._0_4_ + auVar312._0_4_ * auVar233._0_4_;
    auVar261._4_4_ = fVar298 * auVar103._4_4_ + auVar312._4_4_ * auVar233._4_4_;
    auVar261._8_4_ = fVar299 * auVar103._8_4_ + auVar312._8_4_ * auVar233._8_4_;
    auVar261._12_4_ = fVar300 * auVar103._12_4_ + auVar312._12_4_ * auVar233._12_4_;
    auVar261._16_4_ = fVar301 * auVar103._16_4_ + auVar312._16_4_ * auVar233._16_4_;
    auVar261._20_4_ = fVar302 * auVar103._20_4_ + auVar312._20_4_ * auVar233._20_4_;
    auVar261._24_4_ = fVar303 * auVar103._24_4_ + auVar312._24_4_ * auVar233._24_4_;
    auVar261._28_4_ = fVar331 + fVar217 + fVar215;
    auVar297._0_4_ = fVar287 * auVar138._0_4_ + auVar312._0_4_ * auVar281._0_4_;
    auVar297._4_4_ = fVar298 * auVar138._4_4_ + auVar312._4_4_ * auVar281._4_4_;
    auVar297._8_4_ = fVar299 * auVar138._8_4_ + auVar312._8_4_ * auVar281._8_4_;
    auVar297._12_4_ = fVar300 * auVar138._12_4_ + auVar312._12_4_ * auVar281._12_4_;
    auVar297._16_4_ = fVar301 * auVar138._16_4_ + auVar312._16_4_ * auVar281._16_4_;
    auVar297._20_4_ = fVar302 * auVar138._20_4_ + auVar312._20_4_ * auVar281._20_4_;
    auVar297._24_4_ = fVar303 * auVar138._24_4_ + auVar312._24_4_ * auVar281._24_4_;
    auVar297._28_4_ = auVar16._28_4_ + auVar312._28_4_;
    auVar20 = vsubps_avx(auVar233,auVar103);
    auVar18 = vsubps_avx(auVar281,auVar138);
    local_118 = local_518 * auVar20._0_4_ * 3.0;
    fStack_114 = fStack_514 * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_114;
    auVar16._0_4_ = local_118;
    fStack_110 = fStack_510 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_110;
    fStack_10c = fStack_50c * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_10c;
    fStack_108 = local_518 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_108;
    fStack_104 = fStack_514 * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_104;
    fStack_100 = fStack_510 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_100;
    auVar16._28_4_ = auVar20._28_4_;
    local_138 = local_518 * auVar18._0_4_ * 3.0;
    fStack_134 = fStack_514 * auVar18._4_4_ * 3.0;
    auVar21._4_4_ = fStack_134;
    auVar21._0_4_ = local_138;
    fStack_130 = fStack_510 * auVar18._8_4_ * 3.0;
    auVar21._8_4_ = fStack_130;
    fStack_12c = fStack_50c * auVar18._12_4_ * 3.0;
    auVar21._12_4_ = fStack_12c;
    fStack_128 = local_518 * auVar18._16_4_ * 3.0;
    auVar21._16_4_ = fStack_128;
    fStack_124 = fStack_514 * auVar18._20_4_ * 3.0;
    auVar21._20_4_ = fStack_124;
    fStack_120 = fStack_510 * auVar18._24_4_ * 3.0;
    auVar21._24_4_ = fStack_120;
    auVar21._28_4_ = auVar233._28_4_;
    auVar18 = vperm2f128_avx(auVar261,auVar261,1);
    auVar18 = vshufps_avx(auVar18,auVar261,0x30);
    auVar102 = vshufps_avx(auVar261,auVar18,0x29);
    auVar16 = vsubps_avx(auVar261,auVar16);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar18 = vshufps_avx(auVar16,auVar18,0x29);
    auVar21 = vsubps_avx(auVar297,auVar21);
    auVar16 = vperm2f128_avx(auVar21,auVar21,1);
    auVar16 = vshufps_avx(auVar16,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar16,0x29);
    auVar22 = vsubps_avx(auVar261,local_98);
    auVar103 = vsubps_avx(auVar102,auVar101);
    fVar69 = auVar103._0_4_ + auVar22._0_4_;
    fVar106 = auVar103._4_4_ + auVar22._4_4_;
    fVar107 = auVar103._8_4_ + auVar22._8_4_;
    fVar171 = auVar103._12_4_ + auVar22._12_4_;
    fVar186 = auVar103._16_4_ + auVar22._16_4_;
    fVar188 = auVar103._20_4_ + auVar22._20_4_;
    fVar190 = auVar103._24_4_ + auVar22._24_4_;
    auVar16 = vperm2f128_avx(auVar185,auVar185,1);
    auVar16 = vshufps_avx(auVar16,auVar185,0x30);
    local_b8 = vshufps_avx(auVar185,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar297,auVar297,1);
    auVar16 = vshufps_avx(auVar16,auVar297,0x30);
    local_378 = vshufps_avx(auVar297,auVar16,0x29);
    auVar16 = vsubps_avx(auVar297,auVar185);
    auVar138 = vsubps_avx(local_378,local_b8);
    fVar192 = auVar138._0_4_ + auVar16._0_4_;
    fVar215 = auVar138._4_4_ + auVar16._4_4_;
    fVar217 = auVar138._8_4_ + auVar16._8_4_;
    fVar219 = auVar138._12_4_ + auVar16._12_4_;
    fVar191 = auVar138._16_4_ + auVar16._16_4_;
    fVar193 = auVar138._20_4_ + auVar16._20_4_;
    fVar216 = auVar138._24_4_ + auVar16._24_4_;
    auVar23._4_4_ = fVar106 * auVar185._4_4_;
    auVar23._0_4_ = fVar69 * auVar185._0_4_;
    auVar23._8_4_ = fVar107 * auVar185._8_4_;
    auVar23._12_4_ = fVar171 * auVar185._12_4_;
    auVar23._16_4_ = fVar186 * auVar185._16_4_;
    auVar23._20_4_ = fVar188 * auVar185._20_4_;
    auVar23._24_4_ = fVar190 * auVar185._24_4_;
    auVar23._28_4_ = auVar16._28_4_;
    auVar24._4_4_ = fVar215 * local_98._4_4_;
    auVar24._0_4_ = fVar192 * local_98._0_4_;
    auVar24._8_4_ = fVar217 * local_98._8_4_;
    auVar24._12_4_ = fVar219 * local_98._12_4_;
    auVar24._16_4_ = fVar191 * local_98._16_4_;
    auVar24._20_4_ = fVar193 * local_98._20_4_;
    auVar24._24_4_ = fVar216 * local_98._24_4_;
    auVar24._28_4_ = fVar331;
    auVar23 = vsubps_avx(auVar23,auVar24);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar17._28_4_;
    local_f8 = local_f8 + auVar185._0_4_;
    fStack_f4 = fStack_f4 + auVar185._4_4_;
    fStack_f0 = fStack_f0 + auVar185._8_4_;
    fStack_ec = fStack_ec + auVar185._12_4_;
    fStack_e8 = fStack_e8 + auVar185._16_4_;
    fStack_e4 = fStack_e4 + auVar185._20_4_;
    fStack_e0 = fStack_e0 + auVar185._24_4_;
    fStack_dc = fVar334 + auVar185._28_4_;
    auVar17._4_4_ = fVar106 * fStack_f4;
    auVar17._0_4_ = fVar69 * local_f8;
    auVar17._8_4_ = fVar107 * fStack_f0;
    auVar17._12_4_ = fVar171 * fStack_ec;
    auVar17._16_4_ = fVar186 * fStack_e8;
    auVar17._20_4_ = fVar188 * fStack_e4;
    auVar17._24_4_ = fVar190 * fStack_e0;
    auVar17._28_4_ = fVar334;
    auVar25._4_4_ = fVar215 * fStack_d4;
    auVar25._0_4_ = fVar192 * local_d8;
    auVar25._8_4_ = fVar217 * fStack_d0;
    auVar25._12_4_ = fVar219 * fStack_cc;
    auVar25._16_4_ = fVar191 * fStack_c8;
    auVar25._20_4_ = fVar193 * fStack_c4;
    auVar25._24_4_ = fVar216 * fStack_c0;
    auVar25._28_4_ = fVar334 + auVar185._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar25);
    local_538 = auVar19._0_4_;
    fStack_534 = auVar19._4_4_;
    fStack_530 = auVar19._8_4_;
    fStack_52c = auVar19._12_4_;
    fStack_528 = auVar19._16_4_;
    fStack_524 = auVar19._20_4_;
    fStack_520 = auVar19._24_4_;
    auVar26._4_4_ = fVar106 * fStack_534;
    auVar26._0_4_ = fVar69 * local_538;
    auVar26._8_4_ = fVar107 * fStack_530;
    auVar26._12_4_ = fVar171 * fStack_52c;
    auVar26._16_4_ = fVar186 * fStack_528;
    auVar26._20_4_ = fVar188 * fStack_524;
    auVar26._24_4_ = fVar190 * fStack_520;
    auVar26._28_4_ = fVar334;
    local_5a8._0_4_ = auVar100._0_4_;
    local_5a8._4_4_ = auVar100._4_4_;
    fStack_5a0 = auVar100._8_4_;
    fStack_59c = auVar100._12_4_;
    fStack_598 = auVar100._16_4_;
    fStack_594 = auVar100._20_4_;
    fStack_590 = auVar100._24_4_;
    auVar27._4_4_ = fVar215 * (float)local_5a8._4_4_;
    auVar27._0_4_ = fVar192 * (float)local_5a8._0_4_;
    auVar27._8_4_ = fVar217 * fStack_5a0;
    auVar27._12_4_ = fVar219 * fStack_59c;
    auVar27._16_4_ = fVar191 * fStack_598;
    auVar27._20_4_ = fVar193 * fStack_594;
    auVar27._24_4_ = fVar216 * fStack_590;
    auVar27._28_4_ = local_98._28_4_;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_b8._4_4_ * fVar106;
    auVar28._0_4_ = local_b8._0_4_ * fVar69;
    auVar28._8_4_ = local_b8._8_4_ * fVar107;
    auVar28._12_4_ = local_b8._12_4_ * fVar171;
    auVar28._16_4_ = local_b8._16_4_ * fVar186;
    auVar28._20_4_ = local_b8._20_4_ * fVar188;
    auVar28._24_4_ = local_b8._24_4_ * fVar190;
    auVar28._28_4_ = fVar334;
    auVar29._4_4_ = auVar101._4_4_ * fVar215;
    auVar29._0_4_ = auVar101._0_4_ * fVar192;
    auVar29._8_4_ = auVar101._8_4_ * fVar217;
    auVar29._12_4_ = auVar101._12_4_ * fVar219;
    auVar29._16_4_ = auVar101._16_4_ * fVar191;
    auVar29._20_4_ = auVar101._20_4_ * fVar193;
    auVar29._24_4_ = auVar101._24_4_ * fVar216;
    auVar29._28_4_ = local_b8._28_4_;
    local_518 = auVar18._0_4_;
    fStack_514 = auVar18._4_4_;
    fStack_510 = auVar18._8_4_;
    fStack_50c = auVar18._12_4_;
    fStack_508 = auVar18._16_4_;
    fStack_504 = auVar18._20_4_;
    fStack_500 = auVar18._24_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar297._4_4_ * fVar106;
    auVar30._0_4_ = auVar297._0_4_ * fVar69;
    auVar30._8_4_ = auVar297._8_4_ * fVar107;
    auVar30._12_4_ = auVar297._12_4_ * fVar171;
    auVar30._16_4_ = auVar297._16_4_ * fVar186;
    auVar30._20_4_ = auVar297._20_4_ * fVar188;
    auVar30._24_4_ = auVar297._24_4_ * fVar190;
    auVar30._28_4_ = fVar334;
    auVar31._4_4_ = fVar215 * auVar261._4_4_;
    auVar31._0_4_ = fVar192 * auVar261._0_4_;
    auVar31._8_4_ = fVar217 * auVar261._8_4_;
    auVar31._12_4_ = fVar219 * auVar261._12_4_;
    auVar31._16_4_ = fVar191 * auVar261._16_4_;
    auVar31._20_4_ = fVar193 * auVar261._20_4_;
    auVar31._24_4_ = fVar216 * auVar261._24_4_;
    auVar31._28_4_ = fStack_bc;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_118 = auVar261._0_4_ + local_118;
    fStack_114 = auVar261._4_4_ + fStack_114;
    fStack_110 = auVar261._8_4_ + fStack_110;
    fStack_10c = auVar261._12_4_ + fStack_10c;
    fStack_108 = auVar261._16_4_ + fStack_108;
    fStack_104 = auVar261._20_4_ + fStack_104;
    fStack_100 = auVar261._24_4_ + fStack_100;
    fStack_fc = auVar261._28_4_ + auVar20._28_4_;
    local_138 = auVar297._0_4_ + local_138;
    fStack_134 = auVar297._4_4_ + fStack_134;
    fStack_130 = auVar297._8_4_ + fStack_130;
    fStack_12c = auVar297._12_4_ + fStack_12c;
    fStack_128 = auVar297._16_4_ + fStack_128;
    fStack_124 = auVar297._20_4_ + fStack_124;
    fStack_120 = auVar297._24_4_ + fStack_120;
    fStack_11c = auVar297._28_4_ + auVar233._28_4_;
    auVar20._4_4_ = fVar106 * fStack_134;
    auVar20._0_4_ = fVar69 * local_138;
    auVar20._8_4_ = fVar107 * fStack_130;
    auVar20._12_4_ = fVar171 * fStack_12c;
    auVar20._16_4_ = fVar186 * fStack_128;
    auVar20._20_4_ = fVar188 * fStack_124;
    auVar20._24_4_ = fVar190 * fStack_120;
    auVar20._28_4_ = auVar297._28_4_ + auVar233._28_4_;
    auVar32._4_4_ = fStack_114 * fVar215;
    auVar32._0_4_ = local_118 * fVar192;
    auVar32._8_4_ = fStack_110 * fVar217;
    auVar32._12_4_ = fStack_10c * fVar219;
    auVar32._16_4_ = fStack_108 * fVar191;
    auVar32._20_4_ = fStack_104 * fVar193;
    auVar32._24_4_ = fStack_100 * fVar216;
    auVar32._28_4_ = fStack_fc;
    auVar20 = vsubps_avx(auVar20,auVar32);
    auVar33._4_4_ = fVar106 * auVar21._4_4_;
    auVar33._0_4_ = fVar69 * auVar21._0_4_;
    auVar33._8_4_ = fVar107 * auVar21._8_4_;
    auVar33._12_4_ = fVar171 * auVar21._12_4_;
    auVar33._16_4_ = fVar186 * auVar21._16_4_;
    auVar33._20_4_ = fVar188 * auVar21._20_4_;
    auVar33._24_4_ = fVar190 * auVar21._24_4_;
    auVar33._28_4_ = fStack_fc;
    auVar34._4_4_ = fVar215 * fStack_514;
    auVar34._0_4_ = fVar192 * local_518;
    auVar34._8_4_ = fVar217 * fStack_510;
    auVar34._12_4_ = fVar219 * fStack_50c;
    auVar34._16_4_ = fVar191 * fStack_508;
    auVar34._20_4_ = fVar193 * fStack_504;
    auVar34._24_4_ = fVar216 * fStack_500;
    auVar34._28_4_ = auVar21._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar106 * local_378._4_4_;
    auVar35._0_4_ = fVar69 * local_378._0_4_;
    auVar35._8_4_ = fVar107 * local_378._8_4_;
    auVar35._12_4_ = fVar171 * local_378._12_4_;
    auVar35._16_4_ = fVar186 * local_378._16_4_;
    auVar35._20_4_ = fVar188 * local_378._20_4_;
    auVar35._24_4_ = fVar190 * local_378._24_4_;
    auVar35._28_4_ = auVar103._28_4_ + auVar22._28_4_;
    auVar22._4_4_ = auVar102._4_4_ * fVar215;
    auVar22._0_4_ = auVar102._0_4_ * fVar192;
    auVar22._8_4_ = auVar102._8_4_ * fVar217;
    auVar22._12_4_ = auVar102._12_4_ * fVar219;
    auVar22._16_4_ = auVar102._16_4_ * fVar191;
    auVar22._20_4_ = auVar102._20_4_ * fVar193;
    auVar22._24_4_ = auVar102._24_4_ * fVar216;
    auVar22._28_4_ = auVar138._28_4_ + auVar16._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar18 = vminps_avx(auVar23,auVar17);
    auVar100 = vmaxps_avx(auVar23,auVar17);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar24,auVar25);
    auVar100 = vmaxps_avx(auVar100,auVar18);
    auVar16 = vminps_avx(auVar26,auVar20);
    auVar18 = vmaxps_avx(auVar26,auVar20);
    auVar17 = vminps_avx(auVar27,auVar22);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar19,auVar17);
    auVar19 = vmaxps_avx(auVar27,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar100,auVar18);
    auVar100 = vcmpps_avx(auVar17,local_78,2);
    auVar18 = vcmpps_avx(auVar18,local_228,5);
    auVar100 = vandps_avx(auVar18,auVar100);
    auVar18 = local_158 & auVar100;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar101,local_98);
      auVar19 = vsubps_avx(auVar102,auVar261);
      fVar106 = auVar18._0_4_ + auVar19._0_4_;
      fVar107 = auVar18._4_4_ + auVar19._4_4_;
      fVar171 = auVar18._8_4_ + auVar19._8_4_;
      fVar186 = auVar18._12_4_ + auVar19._12_4_;
      fVar188 = auVar18._16_4_ + auVar19._16_4_;
      fVar190 = auVar18._20_4_ + auVar19._20_4_;
      fVar192 = auVar18._24_4_ + auVar19._24_4_;
      auVar17 = vsubps_avx(local_b8,auVar185);
      auVar20 = vsubps_avx(local_378,auVar297);
      fVar215 = auVar17._0_4_ + auVar20._0_4_;
      fVar217 = auVar17._4_4_ + auVar20._4_4_;
      fVar219 = auVar17._8_4_ + auVar20._8_4_;
      fVar191 = auVar17._12_4_ + auVar20._12_4_;
      fVar193 = auVar17._16_4_ + auVar20._16_4_;
      fVar216 = auVar17._20_4_ + auVar20._20_4_;
      fVar218 = auVar17._24_4_ + auVar20._24_4_;
      fVar69 = auVar20._28_4_;
      auVar36._4_4_ = auVar185._4_4_ * fVar107;
      auVar36._0_4_ = auVar185._0_4_ * fVar106;
      auVar36._8_4_ = auVar185._8_4_ * fVar171;
      auVar36._12_4_ = auVar185._12_4_ * fVar186;
      auVar36._16_4_ = auVar185._16_4_ * fVar188;
      auVar36._20_4_ = auVar185._20_4_ * fVar190;
      auVar36._24_4_ = auVar185._24_4_ * fVar192;
      auVar36._28_4_ = auVar185._28_4_;
      auVar37._4_4_ = local_98._4_4_ * fVar217;
      auVar37._0_4_ = local_98._0_4_ * fVar215;
      auVar37._8_4_ = local_98._8_4_ * fVar219;
      auVar37._12_4_ = local_98._12_4_ * fVar191;
      auVar37._16_4_ = local_98._16_4_ * fVar193;
      auVar37._20_4_ = local_98._20_4_ * fVar216;
      auVar37._24_4_ = local_98._24_4_ * fVar218;
      auVar37._28_4_ = local_98._28_4_;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar107 * fStack_f4;
      auVar38._0_4_ = fVar106 * local_f8;
      auVar38._8_4_ = fVar171 * fStack_f0;
      auVar38._12_4_ = fVar186 * fStack_ec;
      auVar38._16_4_ = fVar188 * fStack_e8;
      auVar38._20_4_ = fVar190 * fStack_e4;
      auVar38._24_4_ = fVar192 * fStack_e0;
      auVar38._28_4_ = auVar185._28_4_;
      auVar39._4_4_ = fVar217 * fStack_d4;
      auVar39._0_4_ = fVar215 * local_d8;
      auVar39._8_4_ = fVar219 * fStack_d0;
      auVar39._12_4_ = fVar191 * fStack_cc;
      auVar39._16_4_ = fVar193 * fStack_c8;
      auVar39._20_4_ = fVar216 * fStack_c4;
      auVar39._24_4_ = fVar218 * fStack_c0;
      auVar39._28_4_ = fVar69;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar107 * fStack_534;
      auVar40._0_4_ = fVar106 * local_538;
      auVar40._8_4_ = fVar171 * fStack_530;
      auVar40._12_4_ = fVar186 * fStack_52c;
      auVar40._16_4_ = fVar188 * fStack_528;
      auVar40._20_4_ = fVar190 * fStack_524;
      auVar40._24_4_ = fVar192 * fStack_520;
      auVar40._28_4_ = fVar69;
      auVar41._4_4_ = fVar217 * (float)local_5a8._4_4_;
      auVar41._0_4_ = fVar215 * (float)local_5a8._0_4_;
      auVar41._8_4_ = fVar219 * fStack_5a0;
      auVar41._12_4_ = fVar191 * fStack_59c;
      auVar41._16_4_ = fVar193 * fStack_598;
      auVar41._20_4_ = fVar216 * fStack_594;
      auVar41._24_4_ = fVar218 * fStack_590;
      auVar41._28_4_ = auVar16._28_4_;
      auVar103 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_b8._4_4_ * fVar107;
      auVar42._0_4_ = local_b8._0_4_ * fVar106;
      auVar42._8_4_ = local_b8._8_4_ * fVar171;
      auVar42._12_4_ = local_b8._12_4_ * fVar186;
      auVar42._16_4_ = local_b8._16_4_ * fVar188;
      auVar42._20_4_ = local_b8._20_4_ * fVar190;
      auVar42._24_4_ = local_b8._24_4_ * fVar192;
      auVar42._28_4_ = auVar16._28_4_;
      auVar43._4_4_ = auVar101._4_4_ * fVar217;
      auVar43._0_4_ = auVar101._0_4_ * fVar215;
      auVar43._8_4_ = auVar101._8_4_ * fVar219;
      auVar43._12_4_ = auVar101._12_4_ * fVar191;
      auVar43._16_4_ = auVar101._16_4_ * fVar193;
      auVar43._20_4_ = auVar101._20_4_ * fVar216;
      uVar5 = auVar101._28_4_;
      auVar43._24_4_ = auVar101._24_4_ * fVar218;
      auVar43._28_4_ = uVar5;
      auVar101 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar297._4_4_ * fVar107;
      auVar44._0_4_ = auVar297._0_4_ * fVar106;
      auVar44._8_4_ = auVar297._8_4_ * fVar171;
      auVar44._12_4_ = auVar297._12_4_ * fVar186;
      auVar44._16_4_ = auVar297._16_4_ * fVar188;
      auVar44._20_4_ = auVar297._20_4_ * fVar190;
      auVar44._24_4_ = auVar297._24_4_ * fVar192;
      auVar44._28_4_ = uVar5;
      auVar45._4_4_ = auVar261._4_4_ * fVar217;
      auVar45._0_4_ = auVar261._0_4_ * fVar215;
      auVar45._8_4_ = auVar261._8_4_ * fVar219;
      auVar45._12_4_ = auVar261._12_4_ * fVar191;
      auVar45._16_4_ = auVar261._16_4_ * fVar193;
      auVar45._20_4_ = auVar261._20_4_ * fVar216;
      auVar45._24_4_ = auVar261._24_4_ * fVar218;
      auVar45._28_4_ = auVar261._28_4_;
      auVar138 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar107 * fStack_134;
      auVar46._0_4_ = fVar106 * local_138;
      auVar46._8_4_ = fVar171 * fStack_130;
      auVar46._12_4_ = fVar186 * fStack_12c;
      auVar46._16_4_ = fVar188 * fStack_128;
      auVar46._20_4_ = fVar190 * fStack_124;
      auVar46._24_4_ = fVar192 * fStack_120;
      auVar46._28_4_ = uVar5;
      auVar47._4_4_ = fVar217 * fStack_114;
      auVar47._0_4_ = fVar215 * local_118;
      auVar47._8_4_ = fVar219 * fStack_110;
      auVar47._12_4_ = fVar191 * fStack_10c;
      auVar47._16_4_ = fVar193 * fStack_108;
      auVar47._20_4_ = fVar216 * fStack_104;
      auVar47._24_4_ = fVar218 * fStack_100;
      auVar47._28_4_ = auVar297._28_4_;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar107 * auVar21._4_4_;
      auVar48._0_4_ = fVar106 * auVar21._0_4_;
      auVar48._8_4_ = fVar171 * auVar21._8_4_;
      auVar48._12_4_ = fVar186 * auVar21._12_4_;
      auVar48._16_4_ = fVar188 * auVar21._16_4_;
      auVar48._20_4_ = fVar190 * auVar21._20_4_;
      auVar48._24_4_ = fVar192 * auVar21._24_4_;
      auVar48._28_4_ = auVar297._28_4_;
      auVar49._4_4_ = fStack_514 * fVar217;
      auVar49._0_4_ = local_518 * fVar215;
      auVar49._8_4_ = fStack_510 * fVar219;
      auVar49._12_4_ = fStack_50c * fVar191;
      auVar49._16_4_ = fStack_508 * fVar193;
      auVar49._20_4_ = fStack_504 * fVar216;
      auVar49._24_4_ = fStack_500 * fVar218;
      auVar49._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_378._4_4_ * fVar107;
      auVar50._0_4_ = local_378._0_4_ * fVar106;
      auVar50._8_4_ = local_378._8_4_ * fVar171;
      auVar50._12_4_ = local_378._12_4_ * fVar186;
      auVar50._16_4_ = local_378._16_4_ * fVar188;
      auVar50._20_4_ = local_378._20_4_ * fVar190;
      auVar50._24_4_ = local_378._24_4_ * fVar192;
      auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar51._4_4_ = auVar102._4_4_ * fVar217;
      auVar51._0_4_ = auVar102._0_4_ * fVar215;
      auVar51._8_4_ = auVar102._8_4_ * fVar219;
      auVar51._12_4_ = auVar102._12_4_ * fVar191;
      auVar51._16_4_ = auVar102._16_4_ * fVar193;
      auVar51._20_4_ = auVar102._20_4_ * fVar216;
      auVar51._24_4_ = auVar102._24_4_ * fVar218;
      auVar51._28_4_ = auVar17._28_4_ + fVar69;
      auVar102 = vsubps_avx(auVar50,auVar51);
      auVar19 = vminps_avx(auVar20,auVar22);
      auVar18 = vmaxps_avx(auVar20,auVar22);
      auVar16 = vminps_avx(auVar103,auVar101);
      auVar16 = vminps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar103,auVar101);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar17 = vminps_avx(auVar138,auVar23);
      auVar19 = vmaxps_avx(auVar138,auVar23);
      auVar101 = vminps_avx(auVar21,auVar102);
      auVar17 = vminps_avx(auVar17,auVar101);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar102);
      auVar19 = vmaxps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar17,local_78,2);
      auVar19 = vcmpps_avx(auVar19,local_228,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar100 = vandps_avx(local_158,auVar100);
      auVar19 = auVar100 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar100 = vandps_avx(auVar18,auVar100);
        uVar66 = vmovmskps_avx(auVar100);
        if (uVar66 != 0) {
          uVar64 = (ulong)uVar65;
          auStack_3b8[uVar64] = uVar66 & 0xff;
          uVar6 = vmovlps_avx(local_2e8);
          *(undefined8 *)(afStack_208 + uVar64 * 2) = uVar6;
          uVar63 = vmovlps_avx(auVar84);
          auStack_58[uVar64] = uVar63;
          uVar65 = uVar65 + 1;
        }
      }
    }
LAB_00fba036:
    do {
      do {
        do {
          do {
            if (uVar65 == 0) {
              if ((uVar61 & 1) != 0) goto LAB_00fbb0c6;
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar99._4_4_ = uVar5;
              auVar99._0_4_ = uVar5;
              auVar99._8_4_ = uVar5;
              auVar99._12_4_ = uVar5;
              auVar88 = vcmpps_avx(local_2f8,auVar99,2);
              uVar60 = vmovmskps_avx(auVar88);
              uVar59 = uVar59 & uVar59 + 0xf & uVar60;
              if (uVar59 != 0) goto LAB_00fb8d8e;
              goto LAB_00fbb0c6;
            }
            uVar64 = (ulong)(uVar65 - 1);
            uVar66 = auStack_3b8[uVar64];
            fVar69 = afStack_208[uVar64 * 2];
            fVar106 = afStack_208[uVar64 * 2 + 1];
            auVar84._8_8_ = 0;
            auVar84._0_8_ = auStack_58[uVar64];
            uVar63 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
              }
            }
            uVar66 = uVar66 - 1 & uVar66;
            auStack_3b8[uVar64] = uVar66;
            if (uVar66 == 0) {
              uVar65 = uVar65 - 1;
            }
            fVar171 = (float)(uVar63 + 1) * 0.14285715;
            fVar107 = (1.0 - (float)uVar63 * 0.14285715) * fVar69 +
                      fVar106 * (float)uVar63 * 0.14285715;
            fVar69 = (1.0 - fVar171) * fVar69 + fVar106 * fVar171;
            fVar106 = fVar69 - fVar107;
            if (0.16666667 <= fVar106) {
              local_2e8 = vinsertps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar69),0x10);
              goto LAB_00fb99f8;
            }
            auVar88 = vshufps_avx(auVar84,auVar84,0x50);
            auVar119._8_4_ = 0x3f800000;
            auVar119._0_8_ = 0x3f8000003f800000;
            auVar119._12_4_ = 0x3f800000;
            auVar200 = vsubps_avx(auVar119,auVar88);
            fVar171 = auVar88._0_4_;
            fVar186 = auVar88._4_4_;
            fVar188 = auVar88._8_4_;
            fVar190 = auVar88._12_4_;
            fVar192 = auVar200._0_4_;
            fVar215 = auVar200._4_4_;
            fVar217 = auVar200._8_4_;
            fVar219 = auVar200._12_4_;
            auVar153._0_4_ = fVar171 * auVar276._0_4_ + fVar192 * auVar326._0_4_;
            auVar153._4_4_ = fVar186 * auVar276._4_4_ + fVar215 * auVar326._4_4_;
            auVar153._8_4_ = fVar188 * auVar276._0_4_ + fVar217 * auVar326._0_4_;
            auVar153._12_4_ = fVar190 * auVar276._4_4_ + fVar219 * auVar326._4_4_;
            auVar202._0_4_ = fVar171 * auVar290._0_4_ + fVar192 * auVar118._0_4_;
            auVar202._4_4_ = fVar186 * auVar290._4_4_ + fVar215 * auVar118._4_4_;
            auVar202._8_4_ = fVar188 * auVar290._0_4_ + fVar217 * auVar118._0_4_;
            auVar202._12_4_ = fVar190 * auVar290._4_4_ + fVar219 * auVar118._4_4_;
            auVar225._0_4_ = fVar171 * auVar309._0_4_ + auVar338._0_4_ * fVar192;
            auVar225._4_4_ = fVar186 * auVar309._4_4_ + auVar338._4_4_ * fVar215;
            auVar225._8_4_ = fVar188 * auVar309._0_4_ + auVar338._0_4_ * fVar217;
            auVar225._12_4_ = fVar190 * auVar309._4_4_ + auVar338._4_4_ * fVar219;
            auVar85._0_4_ = fVar171 * auVar82._0_4_ + fVar192 * auVar258._0_4_;
            auVar85._4_4_ = fVar186 * auVar82._4_4_ + fVar215 * auVar258._4_4_;
            auVar85._8_4_ = fVar188 * auVar82._0_4_ + fVar217 * auVar258._0_4_;
            auVar85._12_4_ = fVar190 * auVar82._4_4_ + fVar219 * auVar258._4_4_;
            auVar139._16_16_ = auVar153;
            auVar139._0_16_ = auVar153;
            auVar169._16_16_ = auVar202;
            auVar169._0_16_ = auVar202;
            auVar214._16_16_ = auVar225;
            auVar214._0_16_ = auVar225;
            auVar100 = ZEXT2032(CONCAT416(fVar69,ZEXT416((uint)fVar107)));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar18 = vsubps_avx(auVar169,auVar139);
            fVar171 = auVar100._0_4_;
            fVar186 = auVar100._4_4_;
            fVar188 = auVar100._8_4_;
            fVar190 = auVar100._12_4_;
            fVar192 = auVar100._16_4_;
            fVar215 = auVar100._20_4_;
            fVar217 = auVar100._24_4_;
            auVar140._0_4_ = auVar153._0_4_ + auVar18._0_4_ * fVar171;
            auVar140._4_4_ = auVar153._4_4_ + auVar18._4_4_ * fVar186;
            auVar140._8_4_ = auVar153._8_4_ + auVar18._8_4_ * fVar188;
            auVar140._12_4_ = auVar153._12_4_ + auVar18._12_4_ * fVar190;
            auVar140._16_4_ = auVar153._0_4_ + auVar18._16_4_ * fVar192;
            auVar140._20_4_ = auVar153._4_4_ + auVar18._20_4_ * fVar215;
            auVar140._24_4_ = auVar153._8_4_ + auVar18._24_4_ * fVar217;
            auVar140._28_4_ = auVar153._12_4_ + auVar18._28_4_;
            auVar100 = vsubps_avx(auVar214,auVar169);
            auVar170._0_4_ = auVar202._0_4_ + auVar100._0_4_ * fVar171;
            auVar170._4_4_ = auVar202._4_4_ + auVar100._4_4_ * fVar186;
            auVar170._8_4_ = auVar202._8_4_ + auVar100._8_4_ * fVar188;
            auVar170._12_4_ = auVar202._12_4_ + auVar100._12_4_ * fVar190;
            auVar170._16_4_ = auVar202._0_4_ + auVar100._16_4_ * fVar192;
            auVar170._20_4_ = auVar202._4_4_ + auVar100._20_4_ * fVar215;
            auVar170._24_4_ = auVar202._8_4_ + auVar100._24_4_ * fVar217;
            auVar170._28_4_ = auVar202._12_4_ + auVar100._28_4_;
            auVar88 = vsubps_avx(auVar85,auVar225);
            auVar104._0_4_ = auVar225._0_4_ + auVar88._0_4_ * fVar171;
            auVar104._4_4_ = auVar225._4_4_ + auVar88._4_4_ * fVar186;
            auVar104._8_4_ = auVar225._8_4_ + auVar88._8_4_ * fVar188;
            auVar104._12_4_ = auVar225._12_4_ + auVar88._12_4_ * fVar190;
            auVar104._16_4_ = auVar225._0_4_ + auVar88._0_4_ * fVar192;
            auVar104._20_4_ = auVar225._4_4_ + auVar88._4_4_ * fVar215;
            auVar104._24_4_ = auVar225._8_4_ + auVar88._8_4_ * fVar217;
            auVar104._28_4_ = auVar225._12_4_ + auVar88._12_4_;
            auVar100 = vsubps_avx(auVar170,auVar140);
            auVar141._0_4_ = auVar140._0_4_ + fVar171 * auVar100._0_4_;
            auVar141._4_4_ = auVar140._4_4_ + fVar186 * auVar100._4_4_;
            auVar141._8_4_ = auVar140._8_4_ + fVar188 * auVar100._8_4_;
            auVar141._12_4_ = auVar140._12_4_ + fVar190 * auVar100._12_4_;
            auVar141._16_4_ = auVar140._16_4_ + fVar192 * auVar100._16_4_;
            auVar141._20_4_ = auVar140._20_4_ + fVar215 * auVar100._20_4_;
            auVar141._24_4_ = auVar140._24_4_ + fVar217 * auVar100._24_4_;
            auVar141._28_4_ = auVar140._28_4_ + auVar100._28_4_;
            auVar100 = vsubps_avx(auVar104,auVar170);
            auVar105._0_4_ = auVar170._0_4_ + fVar171 * auVar100._0_4_;
            auVar105._4_4_ = auVar170._4_4_ + fVar186 * auVar100._4_4_;
            auVar105._8_4_ = auVar170._8_4_ + fVar188 * auVar100._8_4_;
            auVar105._12_4_ = auVar170._12_4_ + fVar190 * auVar100._12_4_;
            auVar105._16_4_ = auVar170._16_4_ + fVar192 * auVar100._16_4_;
            auVar105._20_4_ = auVar170._20_4_ + fVar215 * auVar100._20_4_;
            auVar105._24_4_ = auVar170._24_4_ + fVar217 * auVar100._24_4_;
            auVar105._28_4_ = auVar170._28_4_ + auVar100._28_4_;
            auVar100 = vsubps_avx(auVar105,auVar141);
            auVar246._0_4_ = auVar141._0_4_ + fVar171 * auVar100._0_4_;
            auVar246._4_4_ = auVar141._4_4_ + fVar186 * auVar100._4_4_;
            auVar246._8_4_ = auVar141._8_4_ + fVar188 * auVar100._8_4_;
            auVar246._12_4_ = auVar141._12_4_ + fVar190 * auVar100._12_4_;
            auVar249._16_4_ = auVar141._16_4_ + fVar192 * auVar100._16_4_;
            auVar249._0_16_ = auVar246;
            auVar249._20_4_ = auVar141._20_4_ + fVar215 * auVar100._20_4_;
            auVar249._24_4_ = auVar141._24_4_ + fVar217 * auVar100._24_4_;
            auVar249._28_4_ = auVar141._28_4_ + auVar170._28_4_;
            auVar250 = auVar249._16_16_;
            auVar121 = vshufps_avx(ZEXT416((uint)(fVar106 * 0.33333334)),
                                   ZEXT416((uint)(fVar106 * 0.33333334)),0);
            auVar226._0_4_ = auVar246._0_4_ + auVar121._0_4_ * auVar100._0_4_ * 3.0;
            auVar226._4_4_ = auVar246._4_4_ + auVar121._4_4_ * auVar100._4_4_ * 3.0;
            auVar226._8_4_ = auVar246._8_4_ + auVar121._8_4_ * auVar100._8_4_ * 3.0;
            auVar226._12_4_ = auVar246._12_4_ + auVar121._12_4_ * auVar100._12_4_ * 3.0;
            auVar166 = vshufpd_avx(auVar246,auVar246,3);
            auVar132 = vshufpd_avx(auVar250,auVar250,3);
            auVar88 = vsubps_avx(auVar166,auVar246);
            auVar200 = vsubps_avx(auVar132,auVar250);
            auVar86._0_4_ = auVar88._0_4_ + auVar200._0_4_;
            auVar86._4_4_ = auVar88._4_4_ + auVar200._4_4_;
            auVar86._8_4_ = auVar88._8_4_ + auVar200._8_4_;
            auVar86._12_4_ = auVar88._12_4_ + auVar200._12_4_;
            auVar88 = vmovshdup_avx(auVar246);
            auVar200 = vmovshdup_avx(auVar226);
            auVar156 = vshufps_avx(auVar86,auVar86,0);
            auVar122 = vshufps_avx(auVar86,auVar86,0x55);
            fVar171 = auVar122._0_4_;
            fVar186 = auVar122._4_4_;
            fVar188 = auVar122._8_4_;
            fVar190 = auVar122._12_4_;
            fVar192 = auVar156._0_4_;
            fVar215 = auVar156._4_4_;
            fVar217 = auVar156._8_4_;
            fVar219 = auVar156._12_4_;
            auVar87._0_4_ = fVar192 * auVar246._0_4_ + auVar88._0_4_ * fVar171;
            auVar87._4_4_ = fVar215 * auVar246._4_4_ + auVar88._4_4_ * fVar186;
            auVar87._8_4_ = fVar217 * auVar246._8_4_ + auVar88._8_4_ * fVar188;
            auVar87._12_4_ = fVar219 * auVar246._12_4_ + auVar88._12_4_ * fVar190;
            auVar154._0_4_ = fVar192 * auVar226._0_4_ + auVar200._0_4_ * fVar171;
            auVar154._4_4_ = fVar215 * auVar226._4_4_ + auVar200._4_4_ * fVar186;
            auVar154._8_4_ = fVar217 * auVar226._8_4_ + auVar200._8_4_ * fVar188;
            auVar154._12_4_ = fVar219 * auVar226._12_4_ + auVar200._12_4_ * fVar190;
            auVar200 = vshufps_avx(auVar87,auVar87,0xe8);
            auVar156 = vshufps_avx(auVar154,auVar154,0xe8);
            auVar88 = vcmpps_avx(auVar200,auVar156,1);
            uVar66 = vextractps_avx(auVar88,0);
            auVar122 = auVar154;
            if ((uVar66 & 1) == 0) {
              auVar122 = auVar87;
            }
            auVar120._0_4_ = auVar121._0_4_ * auVar100._16_4_ * 3.0;
            auVar120._4_4_ = auVar121._4_4_ * auVar100._20_4_ * 3.0;
            auVar120._8_4_ = auVar121._8_4_ * auVar100._24_4_ * 3.0;
            auVar120._12_4_ = auVar121._12_4_ * 0.0;
            auVar70 = vsubps_avx(auVar250,auVar120);
            auVar121 = vmovshdup_avx(auVar70);
            auVar250 = vmovshdup_avx(auVar250);
            fVar191 = auVar70._0_4_;
            fVar193 = auVar70._4_4_;
            auVar203._0_4_ = fVar191 * fVar192 + auVar121._0_4_ * fVar171;
            auVar203._4_4_ = fVar193 * fVar215 + auVar121._4_4_ * fVar186;
            auVar203._8_4_ = auVar70._8_4_ * fVar217 + auVar121._8_4_ * fVar188;
            auVar203._12_4_ = auVar70._12_4_ * fVar219 + auVar121._12_4_ * fVar190;
            auVar227._0_4_ = fVar192 * auVar249._16_4_ + auVar250._0_4_ * fVar171;
            auVar227._4_4_ = fVar215 * auVar249._20_4_ + auVar250._4_4_ * fVar186;
            auVar227._8_4_ = fVar217 * auVar249._24_4_ + auVar250._8_4_ * fVar188;
            auVar227._12_4_ = fVar219 * auVar249._28_4_ + auVar250._12_4_ * fVar190;
            auVar250 = vshufps_avx(auVar203,auVar203,0xe8);
            auVar15 = vshufps_avx(auVar227,auVar227,0xe8);
            auVar121 = vcmpps_avx(auVar250,auVar15,1);
            uVar66 = vextractps_avx(auVar121,0);
            auVar71 = auVar227;
            if ((uVar66 & 1) == 0) {
              auVar71 = auVar203;
            }
            auVar122 = vmaxss_avx(auVar71,auVar122);
            auVar200 = vminps_avx(auVar200,auVar156);
            auVar156 = vminps_avx(auVar250,auVar15);
            auVar156 = vminps_avx(auVar200,auVar156);
            auVar88 = vshufps_avx(auVar88,auVar88,0x55);
            auVar88 = vblendps_avx(auVar88,auVar121,2);
            auVar121 = vpslld_avx(auVar88,0x1f);
            auVar88 = vshufpd_avx(auVar154,auVar154,1);
            auVar88 = vinsertps_avx(auVar88,auVar227,0x9c);
            auVar200 = vshufpd_avx(auVar87,auVar87,1);
            auVar200 = vinsertps_avx(auVar200,auVar203,0x9c);
            auVar88 = vblendvps_avx(auVar200,auVar88,auVar121);
            auVar200 = vmovshdup_avx(auVar88);
            auVar88 = vmaxss_avx(auVar200,auVar88);
            fVar188 = auVar156._0_4_;
            auVar200 = vmovshdup_avx(auVar156);
            fVar186 = auVar88._0_4_;
            fVar190 = auVar200._0_4_;
            fVar171 = auVar122._0_4_;
            if ((fVar188 < 0.0001) && (-0.0001 < fVar186)) break;
            if ((fVar190 < 0.0001 && -0.0001 < fVar171) || (fVar188 < 0.0001 && -0.0001 < fVar171))
            break;
            auVar121 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar88,1);
            auVar200 = vcmpps_avx(auVar200,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar200 = vandps_avx(auVar200,auVar121);
          } while ((auVar200 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar121 = vcmpps_avx(auVar156,_DAT_01f7aa10,1);
          auVar200 = vcmpss_avx(auVar122,ZEXT416(0),1);
          auVar155._8_4_ = 0x3f800000;
          auVar155._0_8_ = 0x3f8000003f800000;
          auVar155._12_4_ = 0x3f800000;
          auVar204._8_4_ = 0xbf800000;
          auVar204._0_8_ = 0xbf800000bf800000;
          auVar204._12_4_ = 0xbf800000;
          auVar200 = vblendvps_avx(auVar155,auVar204,auVar200);
          auVar121 = vblendvps_avx(auVar155,auVar204,auVar121);
          auVar156 = vcmpss_avx(auVar121,auVar200,4);
          auVar156 = vpshufd_avx(ZEXT416(auVar156._0_4_ & 1),0x50);
          auVar156 = vpslld_avx(auVar156,0x1f);
          auVar156 = vpsrad_avx(auVar156,0x1f);
          auVar156 = vpandn_avx(auVar156,_DAT_01fafeb0);
          auVar122 = vmovshdup_avx(auVar121);
          fVar192 = auVar122._0_4_;
          if ((auVar121._0_4_ != fVar192) || (NAN(auVar121._0_4_) || NAN(fVar192))) {
            if ((fVar190 != fVar188) || (NAN(fVar190) || NAN(fVar188))) {
              fVar188 = -fVar188 / (fVar190 - fVar188);
              auVar121 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar188) * 0.0 + fVar188)));
            }
            else {
              auVar121 = ZEXT816(0x3f80000000000000);
              if ((fVar188 != 0.0) || (NAN(fVar188))) {
                auVar121 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar250 = vcmpps_avx(auVar156,auVar121,1);
            auVar122 = vblendps_avx(auVar156,auVar121,2);
            auVar121 = vblendps_avx(auVar121,auVar156,2);
            auVar156 = vblendvps_avx(auVar121,auVar122,auVar250);
          }
          auVar88 = vcmpss_avx(auVar88,ZEXT416(0),1);
          auVar157._8_4_ = 0x3f800000;
          auVar157._0_8_ = 0x3f8000003f800000;
          auVar157._12_4_ = 0x3f800000;
          auVar205._8_4_ = 0xbf800000;
          auVar205._0_8_ = 0xbf800000bf800000;
          auVar205._12_4_ = 0xbf800000;
          auVar88 = vblendvps_avx(auVar157,auVar205,auVar88);
          fVar188 = auVar88._0_4_;
          if ((auVar200._0_4_ != fVar188) || (NAN(auVar200._0_4_) || NAN(fVar188))) {
            if ((fVar186 != fVar171) || (NAN(fVar186) || NAN(fVar171))) {
              fVar171 = -fVar171 / (fVar186 - fVar171);
              auVar88 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar171) * 0.0 + fVar171)));
            }
            else {
              auVar88 = ZEXT816(0x3f80000000000000);
              if ((fVar171 != 0.0) || (NAN(fVar171))) {
                auVar88 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar121 = vcmpps_avx(auVar156,auVar88,1);
            auVar200 = vblendps_avx(auVar156,auVar88,2);
            auVar88 = vblendps_avx(auVar88,auVar156,2);
            auVar156 = vblendvps_avx(auVar88,auVar200,auVar121);
          }
          if ((fVar192 != fVar188) || (NAN(fVar192) || NAN(fVar188))) {
            auVar89._8_4_ = 0x3f800000;
            auVar89._0_8_ = 0x3f8000003f800000;
            auVar89._12_4_ = 0x3f800000;
            auVar88 = vcmpps_avx(auVar156,auVar89,1);
            auVar200 = vinsertps_avx(auVar156,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar158._4_12_ = auVar156._4_12_;
            auVar158._0_4_ = 0x3f800000;
            auVar156 = vblendvps_avx(auVar158,auVar200,auVar88);
          }
          auVar88 = vcmpps_avx(auVar156,_DAT_01f7b6f0,1);
          auVar53._12_4_ = 0;
          auVar53._0_12_ = auVar156._4_12_;
          auVar200 = vinsertps_avx(auVar156,ZEXT416(0x3f800000),0x10);
          auVar88 = vblendvps_avx(auVar200,auVar53 << 0x20,auVar88);
          auVar200 = vmovshdup_avx(auVar88);
        } while (auVar200._0_4_ < auVar88._0_4_);
        auVar90._0_4_ = auVar88._0_4_ + -0.1;
        auVar90._4_4_ = auVar88._4_4_ + 0.1;
        auVar90._8_4_ = auVar88._8_4_ + 0.0;
        auVar90._12_4_ = auVar88._12_4_ + 0.0;
        auVar121 = vshufpd_avx(auVar226,auVar226,3);
        auVar247._8_8_ = 0x3f80000000000000;
        auVar247._0_8_ = 0x3f80000000000000;
        auVar88 = vcmpps_avx(auVar90,auVar247,1);
        auVar52._12_4_ = 0;
        auVar52._0_12_ = auVar90._4_12_;
        auVar200 = vinsertps_avx(auVar90,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar88 = vblendvps_avx(auVar200,auVar52 << 0x20,auVar88);
        auVar200 = vshufpd_avx(auVar70,auVar70,3);
        auVar156 = vshufps_avx(auVar88,auVar88,0x50);
        auVar248._8_4_ = 0x3f800000;
        auVar248._0_8_ = 0x3f8000003f800000;
        auVar248._12_4_ = 0x3f800000;
        auVar122 = vsubps_avx(auVar248,auVar156);
        local_478 = auVar166._0_4_;
        fStack_474 = auVar166._4_4_;
        fStack_470 = auVar166._8_4_;
        fStack_46c = auVar166._12_4_;
        fVar171 = auVar156._0_4_;
        fVar186 = auVar156._4_4_;
        fVar188 = auVar156._8_4_;
        fVar190 = auVar156._12_4_;
        local_578 = auVar132._0_4_;
        fStack_574 = auVar132._4_4_;
        fStack_570 = auVar132._8_4_;
        fStack_56c = auVar132._12_4_;
        fVar192 = auVar122._0_4_;
        fVar215 = auVar122._4_4_;
        fVar217 = auVar122._8_4_;
        fVar219 = auVar122._12_4_;
        auVar91._0_4_ = fVar171 * local_478 + fVar192 * auVar246._0_4_;
        auVar91._4_4_ = fVar186 * fStack_474 + fVar215 * auVar246._4_4_;
        auVar91._8_4_ = fVar188 * fStack_470 + fVar217 * auVar246._0_4_;
        auVar91._12_4_ = fVar190 * fStack_46c + fVar219 * auVar246._4_4_;
        auVar159._0_4_ = fVar171 * auVar121._0_4_ + fVar192 * auVar226._0_4_;
        auVar159._4_4_ = fVar186 * auVar121._4_4_ + fVar215 * auVar226._4_4_;
        auVar159._8_4_ = fVar188 * auVar121._8_4_ + fVar217 * auVar226._0_4_;
        auVar159._12_4_ = fVar190 * auVar121._12_4_ + fVar219 * auVar226._4_4_;
        auVar228._0_4_ = fVar171 * auVar200._0_4_ + fVar192 * fVar191;
        auVar228._4_4_ = fVar186 * auVar200._4_4_ + fVar215 * fVar193;
        auVar228._8_4_ = fVar188 * auVar200._8_4_ + fVar217 * fVar191;
        auVar228._12_4_ = fVar190 * auVar200._12_4_ + fVar219 * fVar193;
        auVar260._0_4_ = fVar171 * local_578 + fVar192 * auVar249._16_4_;
        auVar260._4_4_ = fVar186 * fStack_574 + fVar215 * auVar249._20_4_;
        auVar260._8_4_ = fVar188 * fStack_570 + fVar217 * auVar249._16_4_;
        auVar260._12_4_ = fVar190 * fStack_56c + fVar219 * auVar249._20_4_;
        auVar132 = vsubps_avx(auVar248,auVar88);
        auVar200 = vmovshdup_avx(auVar84);
        auVar166 = vmovsldup_avx(auVar84);
        auVar84._0_4_ = auVar166._0_4_ * auVar132._0_4_ + auVar88._0_4_ * auVar200._0_4_;
        auVar84._4_4_ = auVar166._4_4_ * auVar132._4_4_ + auVar88._4_4_ * auVar200._4_4_;
        auVar84._8_4_ = auVar166._8_4_ * auVar132._8_4_ + auVar88._8_4_ * auVar200._8_4_;
        auVar84._12_4_ = auVar166._12_4_ * auVar132._12_4_ + auVar88._12_4_ * auVar200._12_4_;
        auVar70 = vmovshdup_avx(auVar84);
        auVar88 = vsubps_avx(auVar159,auVar91);
        auVar183._0_4_ = auVar88._0_4_ * 3.0;
        auVar183._4_4_ = auVar88._4_4_ * 3.0;
        auVar183._8_4_ = auVar88._8_4_ * 3.0;
        auVar183._12_4_ = auVar88._12_4_ * 3.0;
        auVar88 = vsubps_avx(auVar228,auVar159);
        auVar277._0_4_ = auVar88._0_4_ * 3.0;
        auVar277._4_4_ = auVar88._4_4_ * 3.0;
        auVar277._8_4_ = auVar88._8_4_ * 3.0;
        auVar277._12_4_ = auVar88._12_4_ * 3.0;
        auVar88 = vsubps_avx(auVar260,auVar228);
        auVar291._0_4_ = auVar88._0_4_ * 3.0;
        auVar291._4_4_ = auVar88._4_4_ * 3.0;
        auVar291._8_4_ = auVar88._8_4_ * 3.0;
        auVar291._12_4_ = auVar88._12_4_ * 3.0;
        auVar200 = vminps_avx(auVar277,auVar291);
        auVar88 = vmaxps_avx(auVar277,auVar291);
        auVar200 = vminps_avx(auVar183,auVar200);
        auVar88 = vmaxps_avx(auVar183,auVar88);
        auVar166 = vshufpd_avx(auVar200,auVar200,3);
        auVar132 = vshufpd_avx(auVar88,auVar88,3);
        auVar200 = vminps_avx(auVar200,auVar166);
        auVar88 = vmaxps_avx(auVar88,auVar132);
        auVar166 = vshufps_avx(ZEXT416((uint)(1.0 / fVar106)),ZEXT416((uint)(1.0 / fVar106)),0);
        auVar278._0_4_ = auVar200._0_4_ * auVar166._0_4_;
        auVar278._4_4_ = auVar200._4_4_ * auVar166._4_4_;
        auVar278._8_4_ = auVar200._8_4_ * auVar166._8_4_;
        auVar278._12_4_ = auVar200._12_4_ * auVar166._12_4_;
        auVar292._0_4_ = auVar166._0_4_ * auVar88._0_4_;
        auVar292._4_4_ = auVar166._4_4_ * auVar88._4_4_;
        auVar292._8_4_ = auVar166._8_4_ * auVar88._8_4_;
        auVar292._12_4_ = auVar166._12_4_ * auVar88._12_4_;
        auVar122 = ZEXT416((uint)(1.0 / (auVar70._0_4_ - auVar84._0_4_)));
        auVar88 = vshufpd_avx(auVar91,auVar91,3);
        auVar200 = vshufpd_avx(auVar159,auVar159,3);
        auVar166 = vshufpd_avx(auVar228,auVar228,3);
        auVar132 = vshufpd_avx(auVar260,auVar260,3);
        auVar88 = vsubps_avx(auVar88,auVar91);
        auVar121 = vsubps_avx(auVar200,auVar159);
        auVar156 = vsubps_avx(auVar166,auVar228);
        auVar132 = vsubps_avx(auVar132,auVar260);
        auVar200 = vminps_avx(auVar88,auVar121);
        auVar88 = vmaxps_avx(auVar88,auVar121);
        auVar166 = vminps_avx(auVar156,auVar132);
        auVar166 = vminps_avx(auVar200,auVar166);
        auVar200 = vmaxps_avx(auVar156,auVar132);
        auVar88 = vmaxps_avx(auVar88,auVar200);
        auVar200 = vshufps_avx(auVar122,auVar122,0);
        auVar339._0_4_ = auVar200._0_4_ * auVar166._0_4_;
        auVar339._4_4_ = auVar200._4_4_ * auVar166._4_4_;
        auVar339._8_4_ = auVar200._8_4_ * auVar166._8_4_;
        auVar339._12_4_ = auVar200._12_4_ * auVar166._12_4_;
        auVar344._0_4_ = auVar200._0_4_ * auVar88._0_4_;
        auVar344._4_4_ = auVar200._4_4_ * auVar88._4_4_;
        auVar344._8_4_ = auVar200._8_4_ * auVar88._8_4_;
        auVar344._12_4_ = auVar200._12_4_ * auVar88._12_4_;
        auVar88 = vmovsldup_avx(auVar84);
        auVar310._4_12_ = auVar88._4_12_;
        auVar310._0_4_ = fVar107;
        auVar315._4_12_ = auVar84._4_12_;
        auVar315._0_4_ = fVar69;
        auVar184._0_4_ = (fVar107 + fVar69) * 0.5;
        auVar184._4_4_ = (auVar88._4_4_ + auVar84._4_4_) * 0.5;
        auVar184._8_4_ = (auVar88._8_4_ + auVar84._8_4_) * 0.5;
        auVar184._12_4_ = (auVar88._12_4_ + auVar84._12_4_) * 0.5;
        auVar88 = vshufps_avx(auVar184,auVar184,0);
        fVar171 = auVar88._0_4_;
        fVar186 = auVar88._4_4_;
        fVar188 = auVar88._8_4_;
        fVar190 = auVar88._12_4_;
        local_5d8._0_4_ = auVar273._0_4_;
        local_5d8._4_4_ = auVar273._4_4_;
        fStack_5d0 = auVar273._8_4_;
        fStack_5cc = auVar273._12_4_;
        auVar123._0_4_ = fVar171 * (float)local_238._0_4_ + (float)local_5d8._0_4_;
        auVar123._4_4_ = fVar186 * (float)local_238._4_4_ + (float)local_5d8._4_4_;
        auVar123._8_4_ = fVar188 * fStack_230 + fStack_5d0;
        auVar123._12_4_ = fVar190 * fStack_22c + fStack_5cc;
        local_548 = auVar14._0_4_;
        fStack_544 = auVar14._4_4_;
        fStack_540 = auVar14._8_4_;
        fStack_53c = auVar14._12_4_;
        auVar160._0_4_ = fVar171 * (float)local_248._0_4_ + local_548;
        auVar160._4_4_ = fVar186 * (float)local_248._4_4_ + fStack_544;
        auVar160._8_4_ = fVar188 * fStack_240 + fStack_540;
        auVar160._12_4_ = fVar190 * fStack_23c + fStack_53c;
        local_558 = auVar150._0_4_;
        fStack_554 = auVar150._4_4_;
        fStack_550 = auVar150._8_4_;
        fStack_54c = auVar150._12_4_;
        auVar229._0_4_ = fVar171 * (float)local_258._0_4_ + local_558;
        auVar229._4_4_ = fVar186 * (float)local_258._4_4_ + fStack_554;
        auVar229._8_4_ = fVar188 * fStack_250 + fStack_550;
        auVar229._12_4_ = fVar190 * fStack_24c + fStack_54c;
        auVar88 = vsubps_avx(auVar160,auVar123);
        auVar124._0_4_ = auVar123._0_4_ + fVar171 * auVar88._0_4_;
        auVar124._4_4_ = auVar123._4_4_ + fVar186 * auVar88._4_4_;
        auVar124._8_4_ = auVar123._8_4_ + fVar188 * auVar88._8_4_;
        auVar124._12_4_ = auVar123._12_4_ + fVar190 * auVar88._12_4_;
        auVar88 = vsubps_avx(auVar229,auVar160);
        auVar161._0_4_ = auVar160._0_4_ + fVar171 * auVar88._0_4_;
        auVar161._4_4_ = auVar160._4_4_ + fVar186 * auVar88._4_4_;
        auVar161._8_4_ = auVar160._8_4_ + fVar188 * auVar88._8_4_;
        auVar161._12_4_ = auVar160._12_4_ + fVar190 * auVar88._12_4_;
        auVar88 = vsubps_avx(auVar161,auVar124);
        fVar171 = auVar124._0_4_ + fVar171 * auVar88._0_4_;
        fVar186 = auVar124._4_4_ + fVar186 * auVar88._4_4_;
        auVar92._0_8_ = CONCAT44(fVar186,fVar171);
        auVar92._8_4_ = auVar124._8_4_ + fVar188 * auVar88._8_4_;
        auVar92._12_4_ = auVar124._12_4_ + fVar190 * auVar88._12_4_;
        fVar188 = auVar88._0_4_ * 3.0;
        fVar190 = auVar88._4_4_ * 3.0;
        auVar125._0_8_ = CONCAT44(fVar190,fVar188);
        auVar125._8_4_ = auVar88._8_4_ * 3.0;
        auVar125._12_4_ = auVar88._12_4_ * 3.0;
        auVar162._8_8_ = auVar92._0_8_;
        auVar162._0_8_ = auVar92._0_8_;
        auVar88 = vshufpd_avx(auVar92,auVar92,3);
        auVar200 = vshufps_avx(auVar184,auVar184,0x55);
        auVar156 = vsubps_avx(auVar88,auVar162);
        auVar327._0_4_ = auVar156._0_4_ * auVar200._0_4_ + fVar171;
        auVar327._4_4_ = auVar156._4_4_ * auVar200._4_4_ + fVar186;
        auVar327._8_4_ = auVar156._8_4_ * auVar200._8_4_ + fVar171;
        auVar327._12_4_ = auVar156._12_4_ * auVar200._12_4_ + fVar186;
        auVar163._8_8_ = auVar125._0_8_;
        auVar163._0_8_ = auVar125._0_8_;
        auVar88 = vshufpd_avx(auVar125,auVar125,1);
        auVar88 = vsubps_avx(auVar88,auVar163);
        auVar126._0_4_ = auVar88._0_4_ * auVar200._0_4_ + fVar188;
        auVar126._4_4_ = auVar88._4_4_ * auVar200._4_4_ + fVar190;
        auVar126._8_4_ = auVar88._8_4_ * auVar200._8_4_ + fVar188;
        auVar126._12_4_ = auVar88._12_4_ * auVar200._12_4_ + fVar190;
        auVar200 = vmovshdup_avx(auVar126);
        auVar230._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
        auVar230._8_4_ = auVar200._8_4_ ^ 0x80000000;
        auVar230._12_4_ = auVar200._12_4_ ^ 0x80000000;
        auVar166 = vmovshdup_avx(auVar156);
        auVar88 = vunpcklps_avx(auVar166,auVar230);
        auVar132 = vshufps_avx(auVar88,auVar230,4);
        auVar93._0_8_ = auVar156._0_8_ ^ 0x8000000080000000;
        auVar93._8_4_ = -auVar156._8_4_;
        auVar93._12_4_ = -auVar156._12_4_;
        auVar88 = vmovlhps_avx(auVar93,auVar126);
        auVar121 = vshufps_avx(auVar88,auVar126,8);
        auVar88 = ZEXT416((uint)(auVar126._0_4_ * auVar166._0_4_ - auVar156._0_4_ * auVar200._0_4_))
        ;
        auVar200 = vshufps_avx(auVar88,auVar88,0);
        auVar88 = vdivps_avx(auVar132,auVar200);
        auVar200 = vdivps_avx(auVar121,auVar200);
        auVar121 = vinsertps_avx(auVar278,auVar339,0x1c);
        auVar156 = vinsertps_avx(auVar292,auVar344,0x1c);
        auVar122 = vinsertps_avx(auVar339,auVar278,0x4c);
        auVar250 = vinsertps_avx(auVar344,auVar292,0x4c);
        auVar166 = vmovsldup_avx(auVar88);
        auVar293._0_4_ = auVar121._0_4_ * auVar166._0_4_;
        auVar293._4_4_ = auVar121._4_4_ * auVar166._4_4_;
        auVar293._8_4_ = auVar121._8_4_ * auVar166._8_4_;
        auVar293._12_4_ = auVar121._12_4_ * auVar166._12_4_;
        auVar127._0_4_ = auVar166._0_4_ * auVar156._0_4_;
        auVar127._4_4_ = auVar166._4_4_ * auVar156._4_4_;
        auVar127._8_4_ = auVar166._8_4_ * auVar156._8_4_;
        auVar127._12_4_ = auVar166._12_4_ * auVar156._12_4_;
        auVar132 = vminps_avx(auVar293,auVar127);
        auVar166 = vmaxps_avx(auVar127,auVar293);
        auVar15 = vmovsldup_avx(auVar200);
        auVar345._0_4_ = auVar15._0_4_ * auVar122._0_4_;
        auVar345._4_4_ = auVar15._4_4_ * auVar122._4_4_;
        auVar345._8_4_ = auVar15._8_4_ * auVar122._8_4_;
        auVar345._12_4_ = auVar15._12_4_ * auVar122._12_4_;
        auVar294._0_4_ = auVar15._0_4_ * auVar250._0_4_;
        auVar294._4_4_ = auVar15._4_4_ * auVar250._4_4_;
        auVar294._8_4_ = auVar15._8_4_ * auVar250._8_4_;
        auVar294._12_4_ = auVar15._12_4_ * auVar250._12_4_;
        auVar15 = vminps_avx(auVar345,auVar294);
        auVar206._0_4_ = auVar132._0_4_ + auVar15._0_4_;
        auVar206._4_4_ = auVar132._4_4_ + auVar15._4_4_;
        auVar206._8_4_ = auVar132._8_4_ + auVar15._8_4_;
        auVar206._12_4_ = auVar132._12_4_ + auVar15._12_4_;
        auVar132 = vmaxps_avx(auVar294,auVar345);
        auVar15 = vsubps_avx(auVar310,auVar184);
        auVar71 = vsubps_avx(auVar315,auVar184);
        auVar128._0_4_ = auVar132._0_4_ + auVar166._0_4_;
        auVar128._4_4_ = auVar132._4_4_ + auVar166._4_4_;
        auVar128._8_4_ = auVar132._8_4_ + auVar166._8_4_;
        auVar128._12_4_ = auVar132._12_4_ + auVar166._12_4_;
        auVar316._8_8_ = 0x3f800000;
        auVar316._0_8_ = 0x3f800000;
        auVar166 = vsubps_avx(auVar316,auVar128);
        auVar132 = vsubps_avx(auVar316,auVar206);
        fVar217 = auVar15._0_4_;
        auVar317._0_4_ = fVar217 * auVar166._0_4_;
        fVar219 = auVar15._4_4_;
        auVar317._4_4_ = fVar219 * auVar166._4_4_;
        fVar191 = auVar15._8_4_;
        auVar317._8_4_ = fVar191 * auVar166._8_4_;
        fVar193 = auVar15._12_4_;
        auVar317._12_4_ = fVar193 * auVar166._12_4_;
        fVar188 = auVar71._0_4_;
        auVar129._0_4_ = fVar188 * auVar166._0_4_;
        fVar190 = auVar71._4_4_;
        auVar129._4_4_ = fVar190 * auVar166._4_4_;
        fVar192 = auVar71._8_4_;
        auVar129._8_4_ = fVar192 * auVar166._8_4_;
        fVar215 = auVar71._12_4_;
        auVar129._12_4_ = fVar215 * auVar166._12_4_;
        auVar340._0_4_ = fVar217 * auVar132._0_4_;
        auVar340._4_4_ = fVar219 * auVar132._4_4_;
        auVar340._8_4_ = fVar191 * auVar132._8_4_;
        auVar340._12_4_ = fVar193 * auVar132._12_4_;
        auVar207._0_4_ = fVar188 * auVar132._0_4_;
        auVar207._4_4_ = fVar190 * auVar132._4_4_;
        auVar207._8_4_ = fVar192 * auVar132._8_4_;
        auVar207._12_4_ = fVar215 * auVar132._12_4_;
        auVar166 = vminps_avx(auVar317,auVar340);
        auVar132 = vminps_avx(auVar129,auVar207);
        auVar15 = vminps_avx(auVar166,auVar132);
        auVar166 = vmaxps_avx(auVar340,auVar317);
        auVar132 = vmaxps_avx(auVar207,auVar129);
        auVar71 = vshufps_avx(auVar184,auVar184,0x54);
        auVar132 = vmaxps_avx(auVar132,auVar166);
        auVar72 = vshufps_avx(auVar327,auVar327,0);
        auVar110 = vshufps_avx(auVar327,auVar327,0x55);
        auVar166 = vhaddps_avx(auVar15,auVar15);
        auVar132 = vhaddps_avx(auVar132,auVar132);
        auVar208._0_4_ = auVar110._0_4_ * auVar200._0_4_ + auVar72._0_4_ * auVar88._0_4_;
        auVar208._4_4_ = auVar110._4_4_ * auVar200._4_4_ + auVar72._4_4_ * auVar88._4_4_;
        auVar208._8_4_ = auVar110._8_4_ * auVar200._8_4_ + auVar72._8_4_ * auVar88._8_4_;
        auVar208._12_4_ = auVar110._12_4_ * auVar200._12_4_ + auVar72._12_4_ * auVar88._12_4_;
        auVar15 = vsubps_avx(auVar71,auVar208);
        fVar171 = auVar15._0_4_ + auVar166._0_4_;
        fVar186 = auVar15._0_4_ + auVar132._0_4_;
        auVar166 = vmaxss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar171));
        auVar132 = vminss_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar69));
      } while (auVar132._0_4_ < auVar166._0_4_);
      auVar166 = vmovshdup_avx(auVar88);
      auVar209._0_4_ = auVar121._0_4_ * auVar166._0_4_;
      auVar209._4_4_ = auVar121._4_4_ * auVar166._4_4_;
      auVar209._8_4_ = auVar121._8_4_ * auVar166._8_4_;
      auVar209._12_4_ = auVar121._12_4_ * auVar166._12_4_;
      auVar130._0_4_ = auVar166._0_4_ * auVar156._0_4_;
      auVar130._4_4_ = auVar166._4_4_ * auVar156._4_4_;
      auVar130._8_4_ = auVar166._8_4_ * auVar156._8_4_;
      auVar130._12_4_ = auVar166._12_4_ * auVar156._12_4_;
      auVar132 = vminps_avx(auVar209,auVar130);
      auVar166 = vmaxps_avx(auVar130,auVar209);
      auVar121 = vmovshdup_avx(auVar200);
      auVar94._0_4_ = auVar121._0_4_ * auVar122._0_4_;
      auVar94._4_4_ = auVar121._4_4_ * auVar122._4_4_;
      auVar94._8_4_ = auVar121._8_4_ * auVar122._8_4_;
      auVar94._12_4_ = auVar121._12_4_ * auVar122._12_4_;
      auVar210._0_4_ = auVar250._0_4_ * auVar121._0_4_;
      auVar210._4_4_ = auVar250._4_4_ * auVar121._4_4_;
      auVar210._8_4_ = auVar250._8_4_ * auVar121._8_4_;
      auVar210._12_4_ = auVar250._12_4_ * auVar121._12_4_;
      auVar121 = vminps_avx(auVar94,auVar210);
      auVar164._0_4_ = auVar132._0_4_ + auVar121._0_4_;
      auVar164._4_4_ = auVar132._4_4_ + auVar121._4_4_;
      auVar164._8_4_ = auVar132._8_4_ + auVar121._8_4_;
      auVar164._12_4_ = auVar132._12_4_ + auVar121._12_4_;
      auVar132 = vmaxps_avx(auVar210,auVar94);
      auVar95._0_4_ = auVar166._0_4_ + auVar132._0_4_;
      auVar95._4_4_ = auVar166._4_4_ + auVar132._4_4_;
      auVar95._8_4_ = auVar166._8_4_ + auVar132._8_4_;
      auVar95._12_4_ = auVar166._12_4_ + auVar132._12_4_;
      auVar166 = vsubps_avx(auVar247,auVar95);
      auVar132 = vsubps_avx(auVar247,auVar164);
      auVar165._0_4_ = fVar217 * auVar166._0_4_;
      auVar165._4_4_ = fVar219 * auVar166._4_4_;
      auVar165._8_4_ = fVar191 * auVar166._8_4_;
      auVar165._12_4_ = fVar193 * auVar166._12_4_;
      auVar211._0_4_ = fVar217 * auVar132._0_4_;
      auVar211._4_4_ = fVar219 * auVar132._4_4_;
      auVar211._8_4_ = fVar191 * auVar132._8_4_;
      auVar211._12_4_ = fVar193 * auVar132._12_4_;
      auVar96._0_4_ = fVar188 * auVar166._0_4_;
      auVar96._4_4_ = fVar190 * auVar166._4_4_;
      auVar96._8_4_ = fVar192 * auVar166._8_4_;
      auVar96._12_4_ = fVar215 * auVar166._12_4_;
      auVar131._0_4_ = fVar188 * auVar132._0_4_;
      auVar131._4_4_ = fVar190 * auVar132._4_4_;
      auVar131._8_4_ = fVar192 * auVar132._8_4_;
      auVar131._12_4_ = fVar215 * auVar132._12_4_;
      auVar166 = vminps_avx(auVar165,auVar211);
      auVar132 = vminps_avx(auVar96,auVar131);
      auVar166 = vminps_avx(auVar166,auVar132);
      auVar132 = vmaxps_avx(auVar211,auVar165);
      auVar121 = vmaxps_avx(auVar131,auVar96);
      auVar166 = vhaddps_avx(auVar166,auVar166);
      auVar132 = vmaxps_avx(auVar121,auVar132);
      auVar132 = vhaddps_avx(auVar132,auVar132);
      auVar121 = vmovshdup_avx(auVar15);
      auVar156 = ZEXT416((uint)(auVar121._0_4_ + auVar166._0_4_));
      auVar166 = vmaxss_avx(auVar84,auVar156);
      auVar121 = ZEXT416((uint)(auVar121._0_4_ + auVar132._0_4_));
      auVar132 = vminss_avx(auVar121,auVar70);
      auVar346._8_4_ = 0x7fffffff;
      auVar346._0_8_ = 0x7fffffff7fffffff;
      auVar346._12_4_ = 0x7fffffff;
    } while (auVar132._0_4_ < auVar166._0_4_);
    uVar66 = 0;
    if ((fVar107 < fVar171) && (fVar186 < fVar69)) {
      auVar166 = vcmpps_avx(auVar121,auVar70,1);
      auVar132 = vcmpps_avx(auVar84,auVar156,1);
      auVar166 = vandps_avx(auVar132,auVar166);
      uVar66 = auVar166._0_4_;
    }
    if ((3 < uVar65 || fVar106 < 0.001) || (uVar66 & 1) != 0) {
      lVar62 = 200;
      do {
        fVar106 = auVar15._0_4_;
        fVar69 = 1.0 - fVar106;
        auVar166 = ZEXT416((uint)(fVar69 * fVar69 * fVar69));
        auVar166 = vshufps_avx(auVar166,auVar166,0);
        auVar132 = ZEXT416((uint)(fVar106 * 3.0 * fVar69 * fVar69));
        auVar132 = vshufps_avx(auVar132,auVar132,0);
        auVar121 = ZEXT416((uint)(fVar69 * fVar106 * fVar106 * 3.0));
        auVar121 = vshufps_avx(auVar121,auVar121,0);
        auVar156 = ZEXT416((uint)(fVar106 * fVar106 * fVar106));
        auVar156 = vshufps_avx(auVar156,auVar156,0);
        fVar69 = (float)local_5d8._0_4_ * auVar166._0_4_ +
                 local_548 * auVar132._0_4_ +
                 (float)local_3c8._0_4_ * auVar156._0_4_ + local_558 * auVar121._0_4_;
        fVar106 = (float)local_5d8._4_4_ * auVar166._4_4_ +
                  fStack_544 * auVar132._4_4_ +
                  (float)local_3c8._4_4_ * auVar156._4_4_ + fStack_554 * auVar121._4_4_;
        auVar97._0_8_ = CONCAT44(fVar106,fVar69);
        auVar97._8_4_ =
             fStack_5d0 * auVar166._8_4_ +
             fStack_540 * auVar132._8_4_ + fStack_3c0 * auVar156._8_4_ + fStack_550 * auVar121._8_4_
        ;
        auVar97._12_4_ =
             fStack_5cc * auVar166._12_4_ +
             fStack_53c * auVar132._12_4_ +
             fStack_3bc * auVar156._12_4_ + fStack_54c * auVar121._12_4_;
        auVar133._8_8_ = auVar97._0_8_;
        auVar133._0_8_ = auVar97._0_8_;
        auVar132 = vshufpd_avx(auVar97,auVar97,1);
        auVar166 = vmovshdup_avx(auVar15);
        auVar132 = vsubps_avx(auVar132,auVar133);
        auVar98._0_4_ = auVar166._0_4_ * auVar132._0_4_ + fVar69;
        auVar98._4_4_ = auVar166._4_4_ * auVar132._4_4_ + fVar106;
        auVar98._8_4_ = auVar166._8_4_ * auVar132._8_4_ + fVar69;
        auVar98._12_4_ = auVar166._12_4_ * auVar132._12_4_ + fVar106;
        auVar166 = vshufps_avx(auVar98,auVar98,0);
        auVar132 = vshufps_avx(auVar98,auVar98,0x55);
        auVar134._0_4_ = auVar88._0_4_ * auVar166._0_4_ + auVar200._0_4_ * auVar132._0_4_;
        auVar134._4_4_ = auVar88._4_4_ * auVar166._4_4_ + auVar200._4_4_ * auVar132._4_4_;
        auVar134._8_4_ = auVar88._8_4_ * auVar166._8_4_ + auVar200._8_4_ * auVar132._8_4_;
        auVar134._12_4_ = auVar88._12_4_ * auVar166._12_4_ + auVar200._12_4_ * auVar132._12_4_;
        auVar15 = vsubps_avx(auVar15,auVar134);
        auVar166 = vandps_avx(auVar346,auVar98);
        auVar132 = vshufps_avx(auVar166,auVar166,0xf5);
        auVar166 = vmaxss_avx(auVar132,auVar166);
        if (auVar166._0_4_ < (float)local_3d8._0_4_) {
          fVar69 = auVar15._0_4_;
          if ((0.0 <= fVar69) && (fVar69 <= 1.0)) {
            auVar88 = vmovshdup_avx(auVar15);
            fVar106 = auVar88._0_4_;
            if ((0.0 <= fVar106) && (fVar106 <= 1.0)) {
              auVar88 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar250 = vinsertps_avx(auVar88,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar88 = vdpps_avx(auVar250,local_268,0x7f);
              auVar200 = vdpps_avx(auVar250,local_278,0x7f);
              auVar166 = vdpps_avx(auVar250,local_2a8,0x7f);
              auVar132 = vdpps_avx(auVar250,local_2b8,0x7f);
              auVar121 = vdpps_avx(auVar250,local_2c8,0x7f);
              auVar156 = vdpps_avx(auVar250,local_2d8,0x7f);
              fVar190 = 1.0 - fVar106;
              auVar122 = vdpps_avx(auVar250,local_288,0x7f);
              auVar250 = vdpps_avx(auVar250,local_298,0x7f);
              fVar192 = 1.0 - fVar69;
              fVar107 = auVar15._4_4_;
              fVar171 = auVar15._8_4_;
              fVar186 = auVar15._12_4_;
              fVar188 = fVar192 * fVar69 * fVar69 * 3.0;
              auVar231._0_4_ = fVar69 * fVar69 * fVar69;
              auVar231._4_4_ = fVar107 * fVar107 * fVar107;
              auVar231._8_4_ = fVar171 * fVar171 * fVar171;
              auVar231._12_4_ = fVar186 * fVar186 * fVar186;
              fVar107 = fVar69 * 3.0 * fVar192 * fVar192;
              fVar171 = fVar192 * fVar192 * fVar192;
              fVar69 = (fVar190 * auVar88._0_4_ + fVar106 * auVar166._0_4_) * fVar171 +
                       (fVar190 * auVar200._0_4_ + fVar106 * auVar132._0_4_) * fVar107 +
                       fVar188 * (fVar190 * auVar122._0_4_ + fVar106 * auVar121._0_4_) +
                       auVar231._0_4_ * (auVar156._0_4_ * fVar106 + fVar190 * auVar250._0_4_);
              if ((fVar109 <= fVar69) &&
                 (fVar106 = *(float *)(ray + k * 4 + 0x80), fVar69 <= fVar106)) {
                pGVar8 = (context->scene->geometries).items[uVar60].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar68 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar68 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1a8 = vshufps_avx(auVar15,auVar15,0x55);
                  auVar279._8_4_ = 0x3f800000;
                  auVar279._0_8_ = 0x3f8000003f800000;
                  auVar279._12_4_ = 0x3f800000;
                  auVar88 = vsubps_avx(auVar279,local_1a8);
                  fVar186 = local_1a8._0_4_;
                  fVar190 = local_1a8._4_4_;
                  fVar215 = local_1a8._8_4_;
                  fVar217 = local_1a8._12_4_;
                  fVar219 = auVar88._0_4_;
                  fVar191 = auVar88._4_4_;
                  fVar193 = auVar88._8_4_;
                  fVar216 = auVar88._12_4_;
                  auVar295._0_4_ =
                       fVar186 * (float)local_408._0_4_ + fVar219 * (float)local_3e8._0_4_;
                  auVar295._4_4_ =
                       fVar190 * (float)local_408._4_4_ + fVar191 * (float)local_3e8._4_4_;
                  auVar295._8_4_ = fVar215 * fStack_400 + fVar193 * fStack_3e0;
                  auVar295._12_4_ = fVar217 * fStack_3fc + fVar216 * fStack_3dc;
                  auVar311._0_4_ = fVar186 * (float)local_418._0_4_ + fVar219 * fVar221;
                  auVar311._4_4_ = fVar190 * (float)local_418._4_4_ + fVar191 * fVar235;
                  auVar311._8_4_ = fVar215 * fStack_410 + fVar193 * fVar108;
                  auVar311._12_4_ = fVar217 * fStack_40c + fVar216 * fVar187;
                  auVar318._0_4_ = fVar186 * local_428 + fVar219 * (float)local_3f8._0_4_;
                  auVar318._4_4_ = fVar190 * fStack_424 + fVar191 * (float)local_3f8._4_4_;
                  auVar318._8_4_ = fVar215 * fStack_420 + fVar193 * fStack_3f0;
                  auVar318._12_4_ = fVar217 * fStack_41c + fVar216 * fStack_3ec;
                  auVar280._0_4_ = fVar186 * (float)local_438._0_4_ + fVar219 * fVar234;
                  auVar280._4_4_ = fVar190 * (float)local_438._4_4_ + fVar191 * fVar236;
                  auVar280._8_4_ = fVar215 * fStack_430 + fVar193 * fVar172;
                  auVar280._12_4_ = fVar217 * fStack_42c + fVar216 * fVar189;
                  auVar132 = vsubps_avx(auVar311,auVar295);
                  auVar121 = vsubps_avx(auVar318,auVar311);
                  auVar156 = vsubps_avx(auVar280,auVar318);
                  local_1b8 = vshufps_avx(auVar15,auVar15,0);
                  fVar186 = local_1b8._0_4_;
                  fVar215 = local_1b8._4_4_;
                  fVar217 = local_1b8._8_4_;
                  fVar191 = local_1b8._12_4_;
                  auVar88 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                  fVar190 = auVar88._0_4_;
                  fVar192 = auVar88._4_4_;
                  fVar219 = auVar88._8_4_;
                  fVar193 = auVar88._12_4_;
                  auVar88 = vshufps_avx(auVar231,auVar231,0);
                  auVar200 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                  auVar166 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
                  auVar212._0_4_ =
                       ((auVar121._0_4_ * fVar190 + auVar156._0_4_ * fVar186) * fVar186 +
                       (auVar132._0_4_ * fVar190 + auVar121._0_4_ * fVar186) * fVar190) * 3.0;
                  auVar212._4_4_ =
                       ((auVar121._4_4_ * fVar192 + auVar156._4_4_ * fVar215) * fVar215 +
                       (auVar132._4_4_ * fVar192 + auVar121._4_4_ * fVar215) * fVar192) * 3.0;
                  auVar212._8_4_ =
                       ((auVar121._8_4_ * fVar219 + auVar156._8_4_ * fVar217) * fVar217 +
                       (auVar132._8_4_ * fVar219 + auVar121._8_4_ * fVar217) * fVar219) * 3.0;
                  auVar212._12_4_ =
                       ((auVar121._12_4_ * fVar193 + auVar156._12_4_ * fVar191) * fVar191 +
                       (auVar132._12_4_ * fVar193 + auVar121._12_4_ * fVar191) * fVar193) * 3.0;
                  auVar132 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
                  auVar135._0_4_ =
                       auVar132._0_4_ * (float)local_328._0_4_ +
                       auVar166._0_4_ * (float)local_338._0_4_ +
                       auVar88._0_4_ * (float)local_358._0_4_ +
                       auVar200._0_4_ * (float)local_348._0_4_;
                  auVar135._4_4_ =
                       auVar132._4_4_ * (float)local_328._4_4_ +
                       auVar166._4_4_ * (float)local_338._4_4_ +
                       auVar88._4_4_ * (float)local_358._4_4_ +
                       auVar200._4_4_ * (float)local_348._4_4_;
                  auVar135._8_4_ =
                       auVar132._8_4_ * fStack_320 +
                       auVar166._8_4_ * fStack_330 +
                       auVar88._8_4_ * fStack_350 + auVar200._8_4_ * fStack_340;
                  auVar135._12_4_ =
                       auVar132._12_4_ * fStack_31c +
                       auVar166._12_4_ * fStack_32c +
                       auVar88._12_4_ * fStack_34c + auVar200._12_4_ * fStack_33c;
                  auVar88 = vshufps_avx(auVar212,auVar212,0xc9);
                  auVar167._0_4_ = auVar135._0_4_ * auVar88._0_4_;
                  auVar167._4_4_ = auVar135._4_4_ * auVar88._4_4_;
                  auVar167._8_4_ = auVar135._8_4_ * auVar88._8_4_;
                  auVar167._12_4_ = auVar135._12_4_ * auVar88._12_4_;
                  auVar88 = vshufps_avx(auVar135,auVar135,0xc9);
                  auVar136._0_4_ = auVar212._0_4_ * auVar88._0_4_;
                  auVar136._4_4_ = auVar212._4_4_ * auVar88._4_4_;
                  auVar136._8_4_ = auVar212._8_4_ * auVar88._8_4_;
                  auVar136._12_4_ = auVar212._12_4_ * auVar88._12_4_;
                  auVar200 = vsubps_avx(auVar136,auVar167);
                  auVar88 = vshufps_avx(auVar200,auVar200,0x55);
                  local_1e8[0] = (RTCHitN)auVar88[0];
                  local_1e8[1] = (RTCHitN)auVar88[1];
                  local_1e8[2] = (RTCHitN)auVar88[2];
                  local_1e8[3] = (RTCHitN)auVar88[3];
                  local_1e8[4] = (RTCHitN)auVar88[4];
                  local_1e8[5] = (RTCHitN)auVar88[5];
                  local_1e8[6] = (RTCHitN)auVar88[6];
                  local_1e8[7] = (RTCHitN)auVar88[7];
                  local_1e8[8] = (RTCHitN)auVar88[8];
                  local_1e8[9] = (RTCHitN)auVar88[9];
                  local_1e8[10] = (RTCHitN)auVar88[10];
                  local_1e8[0xb] = (RTCHitN)auVar88[0xb];
                  local_1e8[0xc] = (RTCHitN)auVar88[0xc];
                  local_1e8[0xd] = (RTCHitN)auVar88[0xd];
                  local_1e8[0xe] = (RTCHitN)auVar88[0xe];
                  local_1e8[0xf] = (RTCHitN)auVar88[0xf];
                  local_1d8 = vshufps_avx(auVar200,auVar200,0xaa);
                  local_1c8 = vshufps_avx(auVar200,auVar200,0);
                  local_198 = local_318._0_8_;
                  uStack_190 = local_318._8_8_;
                  local_188 = local_308._0_8_;
                  uStack_180 = local_308._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_174 = context->user->instID[0];
                  local_178 = uStack_174;
                  uStack_170 = uStack_174;
                  uStack_16c = uStack_174;
                  uStack_168 = context->user->instPrimID[0];
                  uStack_164 = uStack_168;
                  uStack_160 = uStack_168;
                  uStack_15c = uStack_168;
                  *(float *)(ray + k * 4 + 0x80) = fVar69;
                  local_458 = *local_448;
                  local_3a8.valid = (int *)local_458;
                  local_3a8.geometryUserPtr = pGVar8->userPtr;
                  local_3a8.context = context->user;
                  local_3a8.ray = (RTCRayN *)ray;
                  local_3a8.hit = local_1e8;
                  local_3a8.N = 4;
                  local_378._0_4_ = (int)uVar61;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_3a8);
                    uVar61 = (ulong)(uint)local_378._0_4_;
                  }
                  if (local_458 == (undefined1  [16])0x0) {
                    auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar88 = auVar88 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_3a8);
                      uVar61 = (ulong)(uint)local_378._0_4_;
                    }
                    auVar200 = vpcmpeqd_avx(local_458,_DAT_01f7aa10);
                    auVar88 = auVar200 ^ _DAT_01f7ae20;
                    auVar168._8_4_ = 0xff800000;
                    auVar168._0_8_ = 0xff800000ff800000;
                    auVar168._12_4_ = 0xff800000;
                    auVar200 = vblendvps_avx(auVar168,*(undefined1 (*) [16])(local_3a8.ray + 0x80),
                                             auVar200);
                    *(undefined1 (*) [16])(local_3a8.ray + 0x80) = auVar200;
                  }
                  auVar137._8_8_ = 0x100000001;
                  auVar137._0_8_ = 0x100000001;
                  bVar68 = (auVar137 & auVar88) != (undefined1  [16])0x0;
                  if (!bVar68) {
                    *(float *)(ray + k * 4 + 0x80) = fVar106;
                  }
                }
                uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | bVar68);
              }
            }
          }
          break;
        }
        lVar62 = lVar62 + -1;
      } while (lVar62 != 0);
      goto LAB_00fba036;
    }
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar69),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }